

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  uint uVar63;
  ulong uVar64;
  byte bVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  bool bVar73;
  vint4 bi_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar88 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar105 [32];
  undefined1 auVar89 [16];
  undefined1 auVar106 [32];
  float fVar114;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar118;
  float fVar152;
  float fVar153;
  vint4 bi;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar119;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar129 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar198;
  float fVar199;
  vint4 ai_1;
  undefined1 auVar186 [16];
  float fVar201;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar203;
  undefined1 auVar197 [32];
  float fVar204;
  float fVar205;
  float fVar234;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar206 [16];
  float fVar238;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  float fVar254;
  float fVar255;
  undefined1 auVar241 [16];
  float fVar256;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar257;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  vint4 ai;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar280;
  float fVar298;
  float fVar300;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar299;
  float fVar301;
  float fVar302;
  undefined1 auVar297 [32];
  float fVar303;
  float fVar313;
  float fVar314;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar311 [32];
  float fVar315;
  undefined1 auVar312 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  float fVar333;
  float fVar341;
  float fVar342;
  vfloat4 a0;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar343;
  undefined1 auVar340 [16];
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar355;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar363;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  uint local_528;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar265 [32];
  undefined1 auVar362 [32];
  
  PVar8 = prim[1];
  uVar64 = (ulong)(byte)PVar8;
  lVar68 = uVar64 * 0x25;
  fVar118 = *(float *)(prim + lVar68 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar290 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar290 = vinsertps_avx(auVar290,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar93 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar120._0_4_ = fVar118 * auVar93._0_4_;
  auVar120._4_4_ = fVar118 * auVar93._4_4_;
  auVar120._8_4_ = fVar118 * auVar93._8_4_;
  auVar120._12_4_ = fVar118 * auVar93._12_4_;
  auVar267._0_4_ = fVar118 * auVar290._0_4_;
  auVar267._4_4_ = fVar118 * auVar290._4_4_;
  auVar267._8_4_ = fVar118 * auVar290._8_4_;
  auVar267._12_4_ = fVar118 * auVar290._12_4_;
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar290 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar320 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar320 = vcvtdq2ps_avx(auVar320);
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar64 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar211 = vcvtdq2ps_avx(auVar211);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar170 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar132 = vshufps_avx(auVar267,auVar267,0);
  auVar266 = vshufps_avx(auVar267,auVar267,0x55);
  auVar16 = vshufps_avx(auVar267,auVar267,0xaa);
  fVar118 = auVar16._0_4_;
  fVar119 = auVar16._4_4_;
  fVar152 = auVar16._8_4_;
  fVar153 = auVar16._12_4_;
  fVar204 = auVar266._0_4_;
  fVar234 = auVar266._4_4_;
  fVar236 = auVar266._8_4_;
  fVar238 = auVar266._12_4_;
  fVar185 = auVar132._0_4_;
  fVar198 = auVar132._4_4_;
  fVar199 = auVar132._8_4_;
  fVar201 = auVar132._12_4_;
  auVar334._0_4_ = fVar185 * auVar93._0_4_ + fVar204 * auVar290._0_4_ + fVar118 * auVar180._0_4_;
  auVar334._4_4_ = fVar198 * auVar93._4_4_ + fVar234 * auVar290._4_4_ + fVar119 * auVar180._4_4_;
  auVar334._8_4_ = fVar199 * auVar93._8_4_ + fVar236 * auVar290._8_4_ + fVar152 * auVar180._8_4_;
  auVar334._12_4_ = fVar201 * auVar93._12_4_ + fVar238 * auVar290._12_4_ + fVar153 * auVar180._12_4_
  ;
  auVar348._0_4_ = fVar185 * auVar320._0_4_ + fVar204 * auVar15._0_4_ + auVar211._0_4_ * fVar118;
  auVar348._4_4_ = fVar198 * auVar320._4_4_ + fVar234 * auVar15._4_4_ + auVar211._4_4_ * fVar119;
  auVar348._8_4_ = fVar199 * auVar320._8_4_ + fVar236 * auVar15._8_4_ + auVar211._8_4_ * fVar152;
  auVar348._12_4_ = fVar201 * auVar320._12_4_ + fVar238 * auVar15._12_4_ + auVar211._12_4_ * fVar153
  ;
  auVar268._0_4_ = fVar185 * auVar142._0_4_ + fVar204 * auVar131._0_4_ + auVar170._0_4_ * fVar118;
  auVar268._4_4_ = fVar198 * auVar142._4_4_ + fVar234 * auVar131._4_4_ + auVar170._4_4_ * fVar119;
  auVar268._8_4_ = fVar199 * auVar142._8_4_ + fVar236 * auVar131._8_4_ + auVar170._8_4_ * fVar152;
  auVar268._12_4_ =
       fVar201 * auVar142._12_4_ + fVar238 * auVar131._12_4_ + auVar170._12_4_ * fVar153;
  auVar132 = vshufps_avx(auVar120,auVar120,0);
  auVar266 = vshufps_avx(auVar120,auVar120,0x55);
  auVar16 = vshufps_avx(auVar120,auVar120,0xaa);
  fVar118 = auVar16._0_4_;
  fVar119 = auVar16._4_4_;
  fVar152 = auVar16._8_4_;
  fVar153 = auVar16._12_4_;
  fVar204 = auVar266._0_4_;
  fVar234 = auVar266._4_4_;
  fVar236 = auVar266._8_4_;
  fVar238 = auVar266._12_4_;
  fVar185 = auVar132._0_4_;
  fVar198 = auVar132._4_4_;
  fVar199 = auVar132._8_4_;
  fVar201 = auVar132._12_4_;
  auVar121._0_4_ = fVar185 * auVar93._0_4_ + fVar204 * auVar290._0_4_ + fVar118 * auVar180._0_4_;
  auVar121._4_4_ = fVar198 * auVar93._4_4_ + fVar234 * auVar290._4_4_ + fVar119 * auVar180._4_4_;
  auVar121._8_4_ = fVar199 * auVar93._8_4_ + fVar236 * auVar290._8_4_ + fVar152 * auVar180._8_4_;
  auVar121._12_4_ = fVar201 * auVar93._12_4_ + fVar238 * auVar290._12_4_ + fVar153 * auVar180._12_4_
  ;
  auVar74._0_4_ = fVar185 * auVar320._0_4_ + auVar211._0_4_ * fVar118 + fVar204 * auVar15._0_4_;
  auVar74._4_4_ = fVar198 * auVar320._4_4_ + auVar211._4_4_ * fVar119 + fVar234 * auVar15._4_4_;
  auVar74._8_4_ = fVar199 * auVar320._8_4_ + auVar211._8_4_ * fVar152 + fVar236 * auVar15._8_4_;
  auVar74._12_4_ = fVar201 * auVar320._12_4_ + auVar211._12_4_ * fVar153 + fVar238 * auVar15._12_4_;
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar334,auVar281);
  auVar206._8_4_ = 0x219392ef;
  auVar206._0_8_ = 0x219392ef219392ef;
  auVar206._12_4_ = 0x219392ef;
  auVar93 = vcmpps_avx(auVar93,auVar206,1);
  auVar290 = vblendvps_avx(auVar334,auVar206,auVar93);
  auVar93 = vandps_avx(auVar348,auVar281);
  auVar93 = vcmpps_avx(auVar93,auVar206,1);
  auVar180 = vblendvps_avx(auVar348,auVar206,auVar93);
  auVar93 = vandps_avx(auVar281,auVar268);
  auVar93 = vcmpps_avx(auVar93,auVar206,1);
  auVar93 = vblendvps_avx(auVar268,auVar206,auVar93);
  auVar154._0_4_ = fVar185 * auVar142._0_4_ + fVar204 * auVar131._0_4_ + auVar170._0_4_ * fVar118;
  auVar154._4_4_ = fVar198 * auVar142._4_4_ + fVar234 * auVar131._4_4_ + auVar170._4_4_ * fVar119;
  auVar154._8_4_ = fVar199 * auVar142._8_4_ + fVar236 * auVar131._8_4_ + auVar170._8_4_ * fVar152;
  auVar154._12_4_ =
       fVar201 * auVar142._12_4_ + fVar238 * auVar131._12_4_ + auVar170._12_4_ * fVar153;
  auVar320 = vrcpps_avx(auVar290);
  fVar185 = auVar320._0_4_;
  auVar186._0_4_ = fVar185 * auVar290._0_4_;
  fVar198 = auVar320._4_4_;
  auVar186._4_4_ = fVar198 * auVar290._4_4_;
  fVar199 = auVar320._8_4_;
  auVar186._8_4_ = fVar199 * auVar290._8_4_;
  fVar201 = auVar320._12_4_;
  auVar186._12_4_ = fVar201 * auVar290._12_4_;
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = 0x3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar290 = vsubps_avx(auVar282,auVar186);
  fVar185 = fVar185 + fVar185 * auVar290._0_4_;
  fVar198 = fVar198 + fVar198 * auVar290._4_4_;
  fVar199 = fVar199 + fVar199 * auVar290._8_4_;
  fVar201 = fVar201 + fVar201 * auVar290._12_4_;
  auVar290 = vrcpps_avx(auVar180);
  fVar204 = auVar290._0_4_;
  auVar241._0_4_ = fVar204 * auVar180._0_4_;
  fVar234 = auVar290._4_4_;
  auVar241._4_4_ = fVar234 * auVar180._4_4_;
  fVar236 = auVar290._8_4_;
  auVar241._8_4_ = fVar236 * auVar180._8_4_;
  fVar238 = auVar290._12_4_;
  auVar241._12_4_ = fVar238 * auVar180._12_4_;
  auVar290 = vsubps_avx(auVar282,auVar241);
  fVar204 = fVar204 + fVar204 * auVar290._0_4_;
  fVar234 = fVar234 + fVar234 * auVar290._4_4_;
  fVar236 = fVar236 + fVar236 * auVar290._8_4_;
  fVar238 = fVar238 + fVar238 * auVar290._12_4_;
  auVar290 = vrcpps_avx(auVar93);
  fVar240 = auVar290._0_4_;
  auVar258._0_4_ = fVar240 * auVar93._0_4_;
  fVar254 = auVar290._4_4_;
  auVar258._4_4_ = fVar254 * auVar93._4_4_;
  fVar255 = auVar290._8_4_;
  auVar258._8_4_ = fVar255 * auVar93._8_4_;
  fVar256 = auVar290._12_4_;
  auVar258._12_4_ = fVar256 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar282,auVar258);
  fVar240 = fVar240 + fVar240 * auVar93._0_4_;
  fVar254 = fVar254 + fVar254 * auVar93._4_4_;
  fVar255 = fVar255 + fVar255 * auVar93._8_4_;
  fVar256 = fVar256 + fVar256 * auVar93._12_4_;
  auVar93 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar68 + 0x16)) *
                          *(float *)(prim + lVar68 + 0x1a)));
  auVar180 = vshufps_avx(auVar93,auVar93,0);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar290 = vpmovsxwd_avx(auVar290);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar320 = vsubps_avx(auVar290,auVar93);
  fVar118 = auVar180._0_4_;
  fVar119 = auVar180._4_4_;
  fVar152 = auVar180._8_4_;
  fVar153 = auVar180._12_4_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar290 = vpmovsxwd_avx(auVar180);
  auVar269._0_4_ = auVar320._0_4_ * fVar118 + auVar93._0_4_;
  auVar269._4_4_ = auVar320._4_4_ * fVar119 + auVar93._4_4_;
  auVar269._8_4_ = auVar320._8_4_ * fVar152 + auVar93._8_4_;
  auVar269._12_4_ = auVar320._12_4_ * fVar153 + auVar93._12_4_;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar180 = vpmovsxwd_avx(auVar320);
  auVar93 = vcvtdq2ps_avx(auVar290);
  auVar290 = vcvtdq2ps_avx(auVar180);
  auVar290 = vsubps_avx(auVar290,auVar93);
  auVar283._0_4_ = auVar290._0_4_ * fVar118 + auVar93._0_4_;
  auVar283._4_4_ = auVar290._4_4_ * fVar119 + auVar93._4_4_;
  auVar283._8_4_ = auVar290._8_4_ * fVar152 + auVar93._8_4_;
  auVar283._12_4_ = auVar290._12_4_ * fVar153 + auVar93._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar93 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar67 + 6);
  auVar290 = vpmovsxwd_avx(auVar211);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar93);
  auVar304._0_4_ = auVar290._0_4_ * fVar118 + auVar93._0_4_;
  auVar304._4_4_ = auVar290._4_4_ * fVar119 + auVar93._4_4_;
  auVar304._8_4_ = auVar290._8_4_ * fVar152 + auVar93._8_4_;
  auVar304._12_4_ = auVar290._12_4_ * fVar153 + auVar93._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar93 = vpmovsxwd_avx(auVar142);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar290 = vpmovsxwd_avx(auVar131);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar180 = vsubps_avx(auVar290,auVar93);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar290 = vpmovsxwd_avx(auVar170);
  auVar319._0_4_ = auVar180._0_4_ * fVar118 + auVar93._0_4_;
  auVar319._4_4_ = auVar180._4_4_ * fVar119 + auVar93._4_4_;
  auVar319._8_4_ = auVar180._8_4_ * fVar152 + auVar93._8_4_;
  auVar319._12_4_ = auVar180._12_4_ * fVar153 + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar290);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar290 = vpmovsxwd_avx(auVar132);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar93);
  auVar326._0_4_ = auVar290._0_4_ * fVar118 + auVar93._0_4_;
  auVar326._4_4_ = auVar290._4_4_ * fVar119 + auVar93._4_4_;
  auVar326._8_4_ = auVar290._8_4_ * fVar152 + auVar93._8_4_;
  auVar326._12_4_ = auVar290._12_4_ * fVar153 + auVar93._12_4_;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar64) + 6);
  auVar93 = vpmovsxwd_avx(auVar266);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar290 = vpmovsxwd_avx(auVar16);
  auVar290 = vcvtdq2ps_avx(auVar290);
  auVar290 = vsubps_avx(auVar290,auVar93);
  auVar259._0_4_ = auVar93._0_4_ + auVar290._0_4_ * fVar118;
  auVar259._4_4_ = auVar93._4_4_ + auVar290._4_4_ * fVar119;
  auVar259._8_4_ = auVar93._8_4_ + auVar290._8_4_ * fVar152;
  auVar259._12_4_ = auVar93._12_4_ + auVar290._12_4_ * fVar153;
  auVar93 = vsubps_avx(auVar269,auVar121);
  auVar270._0_4_ = fVar185 * auVar93._0_4_;
  auVar270._4_4_ = fVar198 * auVar93._4_4_;
  auVar270._8_4_ = fVar199 * auVar93._8_4_;
  auVar270._12_4_ = fVar201 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar283,auVar121);
  auVar122._0_4_ = fVar185 * auVar93._0_4_;
  auVar122._4_4_ = fVar198 * auVar93._4_4_;
  auVar122._8_4_ = fVar199 * auVar93._8_4_;
  auVar122._12_4_ = fVar201 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar304,auVar74);
  auVar187._0_4_ = fVar204 * auVar93._0_4_;
  auVar187._4_4_ = fVar234 * auVar93._4_4_;
  auVar187._8_4_ = fVar236 * auVar93._8_4_;
  auVar187._12_4_ = fVar238 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar319,auVar74);
  auVar75._0_4_ = fVar204 * auVar93._0_4_;
  auVar75._4_4_ = fVar234 * auVar93._4_4_;
  auVar75._8_4_ = fVar236 * auVar93._8_4_;
  auVar75._12_4_ = fVar238 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar326,auVar154);
  auVar207._0_4_ = fVar240 * auVar93._0_4_;
  auVar207._4_4_ = fVar254 * auVar93._4_4_;
  auVar207._8_4_ = fVar255 * auVar93._8_4_;
  auVar207._12_4_ = fVar256 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar259,auVar154);
  auVar155._0_4_ = fVar240 * auVar93._0_4_;
  auVar155._4_4_ = fVar254 * auVar93._4_4_;
  auVar155._8_4_ = fVar255 * auVar93._8_4_;
  auVar155._12_4_ = fVar256 * auVar93._12_4_;
  auVar93 = vpminsd_avx(auVar270,auVar122);
  auVar290 = vpminsd_avx(auVar187,auVar75);
  auVar93 = vmaxps_avx(auVar93,auVar290);
  auVar290 = vpminsd_avx(auVar207,auVar155);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar284._4_4_ = uVar6;
  auVar284._0_4_ = uVar6;
  auVar284._8_4_ = uVar6;
  auVar284._12_4_ = uVar6;
  auVar290 = vmaxps_avx(auVar290,auVar284);
  auVar93 = vmaxps_avx(auVar93,auVar290);
  local_410._0_4_ = auVar93._0_4_ * 0.99999964;
  local_410._4_4_ = auVar93._4_4_ * 0.99999964;
  local_410._8_4_ = auVar93._8_4_ * 0.99999964;
  local_410._12_4_ = auVar93._12_4_ * 0.99999964;
  auVar93 = vpmaxsd_avx(auVar270,auVar122);
  auVar290 = vpmaxsd_avx(auVar187,auVar75);
  auVar93 = vminps_avx(auVar93,auVar290);
  auVar290 = vpmaxsd_avx(auVar207,auVar155);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar156._4_4_ = uVar6;
  auVar156._0_4_ = uVar6;
  auVar156._8_4_ = uVar6;
  auVar156._12_4_ = uVar6;
  auVar290 = vminps_avx(auVar290,auVar156);
  auVar93 = vminps_avx(auVar93,auVar290);
  auVar76._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar76._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar76._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar76._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar93 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar290 = vpcmpgtd_avx(auVar93,_DAT_01f7fcf0);
  auVar93 = vcmpps_avx(local_410,auVar76,2);
  auVar93 = vandps_avx(auVar93,auVar290);
  uVar63 = vmovmskps_avx(auVar93);
  if (uVar63 == 0) {
    return false;
  }
  uVar63 = uVar63 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  uVar69 = 1 << ((byte)k & 0x1f);
LAB_00f5ce89:
  lVar68 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar66 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar66].ptr;
  fVar118 = (pGVar9->time_range).lower;
  fVar118 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar118) / ((pGVar9->time_range).upper - fVar118));
  auVar93 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
  auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar93 = vmaxss_avx(ZEXT816(0) << 0x20,auVar93);
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar68 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar93._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar71);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar64);
  fVar119 = *pfVar4;
  fVar152 = pfVar4[1];
  fVar153 = pfVar4[2];
  fVar185 = pfVar4[3];
  lVar1 = uVar64 + 1;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar198 = *pfVar4;
  fVar199 = pfVar4[1];
  fVar201 = pfVar4[2];
  fVar204 = pfVar4[3];
  lVar2 = uVar64 + 2;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar234 = *pfVar4;
  fVar236 = pfVar4[1];
  fVar238 = pfVar4[2];
  fVar240 = pfVar4[3];
  lVar3 = uVar64 + 3;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar254 = *pfVar4;
  fVar255 = pfVar4[1];
  fVar256 = pfVar4[2];
  fVar200 = pfVar4[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar71);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar12 + lVar13 * uVar64);
  fVar202 = *pfVar4;
  fVar205 = pfVar4[1];
  fVar235 = pfVar4[2];
  fVar237 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar239 = *pfVar4;
  fVar112 = pfVar4[1];
  fVar113 = pfVar4[2];
  fVar114 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar115 = *pfVar4;
  fVar116 = pfVar4[1];
  fVar117 = pfVar4[2];
  fVar203 = pfVar4[3];
  fVar118 = fVar118 - auVar93._0_4_;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar257 = *pfVar4;
  fVar279 = pfVar4[1];
  fVar280 = pfVar4[2];
  fVar298 = pfVar4[3];
  local_6e0._0_4_ =
       fVar119 * 0.16666667 + fVar198 * 0.6666667 + fVar234 * 0.16666667 + fVar254 * 0.0;
  local_6e0._4_4_ =
       fVar152 * 0.16666667 + fVar199 * 0.6666667 + fVar236 * 0.16666667 + fVar255 * 0.0;
  fStack_6d8 = fVar153 * 0.16666667 + fVar201 * 0.6666667 + fVar238 * 0.16666667 + fVar256 * 0.0;
  fStack_6d4 = fVar185 * 0.16666667 + fVar204 * 0.6666667 + fVar240 * 0.16666667 + fVar200 * 0.0;
  auVar77._0_4_ = fVar234 * 0.5 + fVar254 * 0.0;
  auVar77._4_4_ = fVar236 * 0.5 + fVar255 * 0.0;
  auVar77._8_4_ = fVar238 * 0.5 + fVar256 * 0.0;
  auVar77._12_4_ = fVar240 * 0.5 + fVar200 * 0.0;
  auVar157._0_4_ = fVar198 * 0.0;
  auVar157._4_4_ = fVar199 * 0.0;
  auVar157._8_4_ = fVar201 * 0.0;
  auVar157._12_4_ = fVar204 * 0.0;
  auVar93 = vsubps_avx(auVar77,auVar157);
  auVar158._0_4_ = fVar119 * 0.5;
  auVar158._4_4_ = fVar152 * 0.5;
  auVar158._8_4_ = fVar153 * 0.5;
  auVar158._12_4_ = fVar185 * 0.5;
  auVar142 = vsubps_avx(auVar93,auVar158);
  auVar78._0_4_ = fVar202 * 0.16666667 + fVar239 * 0.6666667 + fVar115 * 0.16666667 + fVar257 * 0.0;
  auVar78._4_4_ = fVar205 * 0.16666667 + fVar112 * 0.6666667 + fVar116 * 0.16666667 + fVar279 * 0.0;
  auVar78._8_4_ = fVar235 * 0.16666667 + fVar113 * 0.6666667 + fVar117 * 0.16666667 + fVar280 * 0.0;
  auVar78._12_4_ = fVar237 * 0.16666667 + fVar114 * 0.6666667 + fVar203 * 0.16666667 + fVar298 * 0.0
  ;
  auVar260._0_4_ = fVar115 * 0.5 + fVar257 * 0.0;
  auVar260._4_4_ = fVar116 * 0.5 + fVar279 * 0.0;
  auVar260._8_4_ = fVar117 * 0.5 + fVar280 * 0.0;
  auVar260._12_4_ = fVar203 * 0.5 + fVar298 * 0.0;
  auVar335._0_4_ = fVar239 * 0.0;
  auVar335._4_4_ = fVar112 * 0.0;
  auVar335._8_4_ = fVar113 * 0.0;
  auVar335._12_4_ = fVar114 * 0.0;
  auVar93 = vsubps_avx(auVar260,auVar335);
  auVar336._0_4_ = fVar202 * 0.5;
  auVar336._4_4_ = fVar205 * 0.5;
  auVar336._8_4_ = fVar235 * 0.5;
  auVar336._12_4_ = fVar237 * 0.5;
  auVar320 = vsubps_avx(auVar93,auVar336);
  auVar208._0_4_ = fVar119 * 0.0;
  auVar208._4_4_ = fVar152 * 0.0;
  auVar208._8_4_ = fVar153 * 0.0;
  auVar208._12_4_ = fVar185 * 0.0;
  local_6b0._0_4_ =
       auVar208._0_4_ + fVar198 * 0.16666667 + fVar234 * 0.6666667 + fVar254 * 0.16666667;
  local_6b0._4_4_ =
       auVar208._4_4_ + fVar199 * 0.16666667 + fVar236 * 0.6666667 + fVar255 * 0.16666667;
  fStack_6a8 = auVar208._8_4_ + fVar201 * 0.16666667 + fVar238 * 0.6666667 + fVar256 * 0.16666667;
  fStack_6a4 = auVar208._12_4_ + fVar204 * 0.16666667 + fVar240 * 0.6666667 + fVar200 * 0.16666667;
  auVar271._0_4_ = fVar254 * 0.5 + fVar234 * 0.0;
  auVar271._4_4_ = fVar255 * 0.5 + fVar236 * 0.0;
  auVar271._8_4_ = fVar256 * 0.5 + fVar238 * 0.0;
  auVar271._12_4_ = fVar200 * 0.5 + fVar240 * 0.0;
  auVar188._0_4_ = fVar198 * 0.5;
  auVar188._4_4_ = fVar199 * 0.5;
  auVar188._8_4_ = fVar201 * 0.5;
  auVar188._12_4_ = fVar204 * 0.5;
  auVar93 = vsubps_avx(auVar271,auVar188);
  auVar131 = vsubps_avx(auVar93,auVar208);
  auVar209._0_4_ = fVar202 * 0.0;
  auVar209._4_4_ = fVar205 * 0.0;
  auVar209._8_4_ = fVar235 * 0.0;
  auVar209._12_4_ = fVar237 * 0.0;
  auVar189._0_4_ =
       auVar209._0_4_ + fVar239 * 0.16666667 + fVar115 * 0.6666667 + fVar257 * 0.16666667;
  auVar189._4_4_ =
       auVar209._4_4_ + fVar112 * 0.16666667 + fVar116 * 0.6666667 + fVar279 * 0.16666667;
  auVar189._8_4_ =
       auVar209._8_4_ + fVar113 * 0.16666667 + fVar117 * 0.6666667 + fVar280 * 0.16666667;
  auVar189._12_4_ =
       auVar209._12_4_ + fVar114 * 0.16666667 + fVar203 * 0.6666667 + fVar298 * 0.16666667;
  auVar272._0_4_ = fVar115 * 0.0 + fVar257 * 0.5;
  auVar272._4_4_ = fVar116 * 0.0 + fVar279 * 0.5;
  auVar272._8_4_ = fVar117 * 0.0 + fVar280 * 0.5;
  auVar272._12_4_ = fVar203 * 0.0 + fVar298 * 0.5;
  auVar242._0_4_ = fVar239 * 0.5;
  auVar242._4_4_ = fVar112 * 0.5;
  auVar242._8_4_ = fVar113 * 0.5;
  auVar242._12_4_ = fVar114 * 0.5;
  auVar93 = vsubps_avx(auVar272,auVar242);
  auVar211 = vsubps_avx(auVar93,auVar209);
  auVar93 = vshufps_avx(auVar142,auVar142,0xc9);
  auVar290 = vshufps_avx(auVar78,auVar78,0xc9);
  fVar116 = auVar142._0_4_;
  auVar273._0_4_ = fVar116 * auVar290._0_4_;
  fVar117 = auVar142._4_4_;
  auVar273._4_4_ = fVar117 * auVar290._4_4_;
  fVar203 = auVar142._8_4_;
  auVar273._8_4_ = fVar203 * auVar290._8_4_;
  fVar257 = auVar142._12_4_;
  auVar273._12_4_ = fVar257 * auVar290._12_4_;
  auVar79._0_4_ = auVar93._0_4_ * auVar78._0_4_;
  auVar79._4_4_ = auVar93._4_4_ * auVar78._4_4_;
  auVar79._8_4_ = auVar93._8_4_ * auVar78._8_4_;
  auVar79._12_4_ = auVar93._12_4_ * auVar78._12_4_;
  auVar290 = vsubps_avx(auVar79,auVar273);
  auVar180 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar290 = vshufps_avx(auVar320,auVar320,0xc9);
  auVar274._0_4_ = fVar116 * auVar290._0_4_;
  auVar274._4_4_ = fVar117 * auVar290._4_4_;
  auVar274._8_4_ = fVar203 * auVar290._8_4_;
  auVar274._12_4_ = fVar257 * auVar290._12_4_;
  auVar243._0_4_ = auVar320._0_4_ * auVar93._0_4_;
  auVar243._4_4_ = auVar320._4_4_ * auVar93._4_4_;
  auVar243._8_4_ = auVar320._8_4_ * auVar93._8_4_;
  auVar243._12_4_ = auVar320._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar243,auVar274);
  auVar320 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar93 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar290 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar279 = auVar131._0_4_;
  auVar285._0_4_ = fVar279 * auVar290._0_4_;
  fVar280 = auVar131._4_4_;
  auVar285._4_4_ = fVar280 * auVar290._4_4_;
  fVar298 = auVar131._8_4_;
  auVar285._8_4_ = fVar298 * auVar290._8_4_;
  fVar299 = auVar131._12_4_;
  auVar285._12_4_ = fVar299 * auVar290._12_4_;
  auVar190._0_4_ = auVar93._0_4_ * auVar189._0_4_;
  auVar190._4_4_ = auVar93._4_4_ * auVar189._4_4_;
  auVar190._8_4_ = auVar93._8_4_ * auVar189._8_4_;
  auVar190._12_4_ = auVar93._12_4_ * auVar189._12_4_;
  auVar290 = vsubps_avx(auVar190,auVar285);
  auVar15 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar290 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar286._0_4_ = fVar279 * auVar290._0_4_;
  auVar286._4_4_ = fVar280 * auVar290._4_4_;
  auVar286._8_4_ = fVar298 * auVar290._8_4_;
  auVar286._12_4_ = fVar299 * auVar290._12_4_;
  auVar210._0_4_ = auVar93._0_4_ * auVar211._0_4_;
  auVar210._4_4_ = auVar93._4_4_ * auVar211._4_4_;
  auVar210._8_4_ = auVar93._8_4_ * auVar211._8_4_;
  auVar210._12_4_ = auVar93._12_4_ * auVar211._12_4_;
  auVar170 = vsubps_avx(auVar210,auVar286);
  auVar93 = vdpps_avx(auVar180,auVar180,0x7f);
  fVar152 = auVar93._0_4_;
  auVar266 = ZEXT416((uint)fVar152);
  auVar290 = vrsqrtss_avx(auVar266,auVar266);
  fVar119 = auVar290._0_4_;
  auVar290 = vdpps_avx(auVar180,auVar320,0x7f);
  auVar211 = ZEXT416((uint)(fVar119 * 1.5 - fVar152 * 0.5 * fVar119 * fVar119 * fVar119));
  auVar211 = vshufps_avx(auVar211,auVar211,0);
  fVar205 = auVar211._0_4_ * auVar180._0_4_;
  fVar235 = auVar211._4_4_ * auVar180._4_4_;
  fVar237 = auVar211._8_4_ * auVar180._8_4_;
  fVar239 = auVar211._12_4_ * auVar180._12_4_;
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar275._0_4_ = auVar93._0_4_ * auVar320._0_4_;
  auVar275._4_4_ = auVar93._4_4_ * auVar320._4_4_;
  auVar275._8_4_ = auVar93._8_4_ * auVar320._8_4_;
  auVar275._12_4_ = auVar93._12_4_ * auVar320._12_4_;
  auVar93 = vshufps_avx(auVar290,auVar290,0);
  auVar80._0_4_ = auVar93._0_4_ * auVar180._0_4_;
  auVar80._4_4_ = auVar93._4_4_ * auVar180._4_4_;
  auVar80._8_4_ = auVar93._8_4_ * auVar180._8_4_;
  auVar80._12_4_ = auVar93._12_4_ * auVar180._12_4_;
  auVar132 = vsubps_avx(auVar275,auVar80);
  auVar93 = vrcpss_avx(auVar266,auVar266);
  auVar93 = ZEXT416((uint)((2.0 - fVar152 * auVar93._0_4_) * auVar93._0_4_));
  auVar180 = vshufps_avx(auVar93,auVar93,0);
  auVar93 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar112 = auVar93._0_4_;
  auVar320 = ZEXT416((uint)fVar112);
  auVar290 = vrsqrtss_avx(auVar320,auVar320);
  fVar255 = auVar290._0_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar71);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar71);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * uVar64);
  auVar62 = *pauVar5;
  fVar119 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar152 = *pfVar4;
  fVar153 = pfVar4[1];
  fVar185 = pfVar4[2];
  fVar198 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar199 = *pfVar4;
  fVar201 = pfVar4[1];
  fVar204 = pfVar4[2];
  fVar234 = pfVar4[3];
  auVar290 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar356._0_4_ = auVar93._0_4_ * auVar290._0_4_;
  auVar356._4_4_ = auVar93._4_4_ * auVar290._4_4_;
  auVar356._8_4_ = auVar93._8_4_ * auVar290._8_4_;
  auVar356._12_4_ = auVar93._12_4_ * auVar290._12_4_;
  auVar93 = vdpps_avx(auVar15,auVar290,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar81._0_4_ = auVar93._0_4_ * auVar15._0_4_;
  auVar81._4_4_ = auVar93._4_4_ * auVar15._4_4_;
  auVar81._8_4_ = auVar93._8_4_ * auVar15._8_4_;
  auVar81._12_4_ = auVar93._12_4_ * auVar15._12_4_;
  auVar170 = vsubps_avx(auVar356,auVar81);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar236 = *pfVar4;
  fVar238 = pfVar4[1];
  fVar240 = pfVar4[2];
  fVar254 = pfVar4[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar71);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar71);
  auVar93 = ZEXT416((uint)(fVar255 * 1.5 - fVar255 * fVar255 * fVar255 * fVar112 * 0.5));
  auVar290 = vshufps_avx(auVar93,auVar93,0);
  fVar255 = auVar15._0_4_ * auVar290._0_4_;
  fVar256 = auVar15._4_4_ * auVar290._4_4_;
  fVar200 = auVar15._8_4_ * auVar290._8_4_;
  fVar202 = auVar15._12_4_ * auVar290._12_4_;
  auVar93 = vrcpss_avx(auVar320,auVar320);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar112 * auVar93._0_4_)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar320 = vshufps_avx(_local_6e0,_local_6e0,0xff);
  auVar321._0_4_ = auVar320._0_4_ * fVar205;
  auVar321._4_4_ = auVar320._4_4_ * fVar235;
  auVar321._8_4_ = auVar320._8_4_ * fVar237;
  auVar321._12_4_ = auVar320._12_4_ * fVar239;
  auVar15 = vshufps_avx(auVar142,auVar142,0xff);
  auVar266 = vsubps_avx(_local_6e0,auVar321);
  auVar212._0_4_ =
       auVar15._0_4_ * fVar205 + auVar320._0_4_ * auVar211._0_4_ * auVar132._0_4_ * auVar180._0_4_;
  auVar212._4_4_ =
       auVar15._4_4_ * fVar235 + auVar320._4_4_ * auVar211._4_4_ * auVar132._4_4_ * auVar180._4_4_;
  auVar212._8_4_ =
       auVar15._8_4_ * fVar237 + auVar320._8_4_ * auVar211._8_4_ * auVar132._8_4_ * auVar180._8_4_;
  auVar212._12_4_ =
       auVar15._12_4_ * fVar239 +
       auVar320._12_4_ * auVar211._12_4_ * auVar132._12_4_ * auVar180._12_4_;
  auVar142 = vsubps_avx(auVar142,auVar212);
  local_6e0._0_4_ = (float)local_6e0._0_4_ + auVar321._0_4_;
  local_6e0._4_4_ = (float)local_6e0._4_4_ + auVar321._4_4_;
  fStack_6d8 = fStack_6d8 + auVar321._8_4_;
  fStack_6d4 = fStack_6d4 + auVar321._12_4_;
  auVar180 = vshufps_avx(_local_6b0,_local_6b0,0xff);
  auVar159._0_4_ = auVar180._0_4_ * fVar255;
  auVar159._4_4_ = auVar180._4_4_ * fVar256;
  auVar159._8_4_ = auVar180._8_4_ * fVar200;
  auVar159._12_4_ = auVar180._12_4_ * fVar202;
  auVar320 = vshufps_avx(auVar131,auVar131,0xff);
  auVar132 = vsubps_avx(_local_6b0,auVar159);
  auVar82._0_4_ =
       auVar320._0_4_ * fVar255 + auVar180._0_4_ * auVar290._0_4_ * auVar93._0_4_ * auVar170._0_4_;
  auVar82._4_4_ =
       auVar320._4_4_ * fVar256 + auVar180._4_4_ * auVar290._4_4_ * auVar93._4_4_ * auVar170._4_4_;
  auVar82._8_4_ =
       auVar320._8_4_ * fVar200 + auVar180._8_4_ * auVar290._8_4_ * auVar93._8_4_ * auVar170._8_4_;
  auVar82._12_4_ =
       auVar320._12_4_ * fVar202 +
       auVar180._12_4_ * auVar290._12_4_ * auVar93._12_4_ * auVar170._12_4_;
  auVar131 = vsubps_avx(auVar131,auVar82);
  local_6b0._0_4_ = (float)local_6b0._0_4_ + auVar159._0_4_;
  local_6b0._4_4_ = (float)local_6b0._4_4_ + auVar159._4_4_;
  fStack_6a8 = fStack_6a8 + auVar159._8_4_;
  fStack_6a4 = fStack_6a4 + auVar159._12_4_;
  local_700._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar152 * 0.6666667 + fVar199 * 0.16666667 + fVar236 * 0.0;
  local_700._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar153 * 0.6666667 + fVar201 * 0.16666667 + fVar238 * 0.0;
  fStack_6f8 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar185 * 0.6666667 + fVar204 * 0.16666667 + fVar240 * 0.0;
  fStack_6f4 = fVar119 * 0.16666667 + fVar198 * 0.6666667 + fVar234 * 0.16666667 + fVar254 * 0.0;
  auVar83._0_4_ = fVar199 * 0.5 + fVar236 * 0.0;
  auVar83._4_4_ = fVar201 * 0.5 + fVar238 * 0.0;
  auVar83._8_4_ = fVar204 * 0.5 + fVar240 * 0.0;
  auVar83._12_4_ = fVar234 * 0.5 + fVar254 * 0.0;
  auVar123._0_4_ = fVar152 * 0.0;
  auVar123._4_4_ = fVar153 * 0.0;
  auVar123._8_4_ = fVar185 * 0.0;
  auVar123._12_4_ = fVar198 * 0.0;
  auVar93 = vsubps_avx(auVar83,auVar123);
  auVar124._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar124._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar124._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar124._12_4_ = fVar119 * 0.5;
  auVar170 = vsubps_avx(auVar93,auVar124);
  auVar93 = *(undefined1 (*) [16])(lVar12 + lVar2 * lVar11);
  pfVar4 = (float *)(lVar12 + lVar11 * lVar3);
  fVar255 = *pfVar4;
  fVar256 = pfVar4[1];
  fVar200 = pfVar4[2];
  fVar202 = pfVar4[3];
  fVar333 = auVar93._0_4_;
  fVar300 = auVar93._4_4_;
  fVar341 = auVar93._8_4_;
  fVar301 = auVar93._12_4_;
  pfVar4 = (float *)(lVar12 + lVar1 * lVar11);
  fVar205 = *pfVar4;
  fVar235 = pfVar4[1];
  fVar237 = pfVar4[2];
  fVar239 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + uVar64 * lVar11);
  fVar112 = *pfVar4;
  fVar113 = pfVar4[1];
  fVar114 = pfVar4[2];
  fVar115 = pfVar4[3];
  auVar213._0_4_ = fVar112 * 0.16666667 + fVar205 * 0.6666667 + fVar333 * 0.16666667 + fVar255 * 0.0
  ;
  auVar213._4_4_ = fVar113 * 0.16666667 + fVar235 * 0.6666667 + fVar300 * 0.16666667 + fVar256 * 0.0
  ;
  auVar213._8_4_ = fVar114 * 0.16666667 + fVar237 * 0.6666667 + fVar341 * 0.16666667 + fVar200 * 0.0
  ;
  auVar213._12_4_ =
       fVar115 * 0.16666667 + fVar239 * 0.6666667 + fVar301 * 0.16666667 + fVar202 * 0.0;
  auVar191._0_4_ = fVar333 * 0.5 + fVar255 * 0.0;
  auVar191._4_4_ = fVar300 * 0.5 + fVar256 * 0.0;
  auVar191._8_4_ = fVar341 * 0.5 + fVar200 * 0.0;
  auVar191._12_4_ = fVar301 * 0.5 + fVar202 * 0.0;
  auVar287._0_4_ = fVar205 * 0.0;
  auVar287._4_4_ = fVar235 * 0.0;
  auVar287._8_4_ = fVar237 * 0.0;
  auVar287._12_4_ = fVar239 * 0.0;
  auVar93 = vsubps_avx(auVar191,auVar287);
  auVar288._0_4_ = fVar112 * 0.5;
  auVar288._4_4_ = fVar113 * 0.5;
  auVar288._8_4_ = fVar114 * 0.5;
  auVar288._12_4_ = fVar115 * 0.5;
  auVar290 = vsubps_avx(auVar93,auVar288);
  auVar289._0_4_ = fVar199 * 0.0 + fVar236 * 0.5;
  auVar289._4_4_ = fVar201 * 0.0 + fVar238 * 0.5;
  auVar289._8_4_ = fVar204 * 0.0 + fVar240 * 0.5;
  auVar289._12_4_ = fVar234 * 0.0 + fVar254 * 0.5;
  auVar337._0_4_ = fVar152 * 0.5;
  auVar337._4_4_ = fVar153 * 0.5;
  auVar337._8_4_ = fVar185 * 0.5;
  auVar337._12_4_ = fVar198 * 0.5;
  auVar93 = vsubps_avx(auVar289,auVar337);
  local_6c0 = auVar62._0_4_;
  fStack_6bc = auVar62._4_4_;
  fStack_6b8 = auVar62._8_4_;
  auVar327._0_4_ = local_6c0 * 0.0;
  auVar327._4_4_ = fStack_6bc * 0.0;
  auVar327._8_4_ = fStack_6b8 * 0.0;
  auVar327._12_4_ = fVar119 * 0.0;
  auVar338._0_4_ =
       auVar327._0_4_ + fVar152 * 0.16666667 + fVar236 * 0.16666667 + fVar199 * 0.6666667;
  auVar338._4_4_ =
       auVar327._4_4_ + fVar153 * 0.16666667 + fVar238 * 0.16666667 + fVar201 * 0.6666667;
  auVar338._8_4_ =
       auVar327._8_4_ + fVar185 * 0.16666667 + fVar240 * 0.16666667 + fVar204 * 0.6666667;
  auVar338._12_4_ =
       auVar327._12_4_ + fVar198 * 0.16666667 + fVar254 * 0.16666667 + fVar234 * 0.6666667;
  auVar16 = vsubps_avx(auVar93,auVar327);
  auVar160._0_4_ = fVar333 * 0.0 + fVar255 * 0.5;
  auVar160._4_4_ = fVar300 * 0.0 + fVar256 * 0.5;
  auVar160._8_4_ = fVar341 * 0.0 + fVar200 * 0.5;
  auVar160._12_4_ = fVar301 * 0.0 + fVar202 * 0.5;
  auVar84._0_4_ = fVar205 * 0.5;
  auVar84._4_4_ = fVar235 * 0.5;
  auVar84._8_4_ = fVar237 * 0.5;
  auVar84._12_4_ = fVar239 * 0.5;
  auVar93 = vsubps_avx(auVar160,auVar84);
  auVar125._0_4_ = fVar112 * 0.0;
  auVar125._4_4_ = fVar113 * 0.0;
  auVar125._8_4_ = fVar114 * 0.0;
  auVar125._12_4_ = fVar115 * 0.0;
  auVar161._0_4_ =
       auVar125._0_4_ + fVar205 * 0.16666667 + fVar333 * 0.6666667 + fVar255 * 0.16666667;
  auVar161._4_4_ =
       auVar125._4_4_ + fVar235 * 0.16666667 + fVar300 * 0.6666667 + fVar256 * 0.16666667;
  auVar161._8_4_ =
       auVar125._8_4_ + fVar237 * 0.16666667 + fVar341 * 0.6666667 + fVar200 * 0.16666667;
  auVar161._12_4_ =
       auVar125._12_4_ + fVar239 * 0.16666667 + fVar301 * 0.6666667 + fVar202 * 0.16666667;
  auVar320 = vsubps_avx(auVar93,auVar125);
  auVar93 = vshufps_avx(auVar213,auVar213,0xc9);
  fVar234 = auVar170._0_4_;
  auVar126._0_4_ = fVar234 * auVar93._0_4_;
  fVar236 = auVar170._4_4_;
  auVar126._4_4_ = fVar236 * auVar93._4_4_;
  fVar238 = auVar170._8_4_;
  auVar126._8_4_ = fVar238 * auVar93._8_4_;
  fVar255 = auVar170._12_4_;
  auVar126._12_4_ = fVar255 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar214._0_4_ = auVar93._0_4_ * auVar213._0_4_;
  auVar214._4_4_ = auVar93._4_4_ * auVar213._4_4_;
  auVar214._8_4_ = auVar93._8_4_ * auVar213._8_4_;
  auVar214._12_4_ = auVar93._12_4_ * auVar213._12_4_;
  auVar180 = vsubps_avx(auVar214,auVar126);
  auVar215._0_4_ = auVar93._0_4_ * auVar290._0_4_;
  auVar215._4_4_ = auVar93._4_4_ * auVar290._4_4_;
  auVar215._8_4_ = auVar93._8_4_ * auVar290._8_4_;
  auVar215._12_4_ = auVar93._12_4_ * auVar290._12_4_;
  auVar93 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar192._0_4_ = fVar234 * auVar93._0_4_;
  auVar192._4_4_ = fVar236 * auVar93._4_4_;
  auVar192._8_4_ = fVar238 * auVar93._8_4_;
  auVar192._12_4_ = fVar255 * auVar93._12_4_;
  auVar15 = vsubps_avx(auVar215,auVar192);
  auVar93 = vshufps_avx(auVar161,auVar161,0xc9);
  fVar254 = auVar16._0_4_;
  auVar216._0_4_ = fVar254 * auVar93._0_4_;
  fVar200 = auVar16._4_4_;
  auVar216._4_4_ = fVar200 * auVar93._4_4_;
  fVar202 = auVar16._8_4_;
  auVar216._8_4_ = fVar202 * auVar93._8_4_;
  fVar235 = auVar16._12_4_;
  auVar216._12_4_ = fVar235 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar162._0_4_ = auVar93._0_4_ * auVar161._0_4_;
  auVar162._4_4_ = auVar93._4_4_ * auVar161._4_4_;
  auVar162._8_4_ = auVar93._8_4_ * auVar161._8_4_;
  auVar162._12_4_ = auVar93._12_4_ * auVar161._12_4_;
  auVar211 = vsubps_avx(auVar162,auVar216);
  auVar180 = vshufps_avx(auVar180,auVar180,0xc9);
  auVar217._0_4_ = auVar93._0_4_ * auVar320._0_4_;
  auVar217._4_4_ = auVar93._4_4_ * auVar320._4_4_;
  auVar217._8_4_ = auVar93._8_4_ * auVar320._8_4_;
  auVar217._12_4_ = auVar93._12_4_ * auVar320._12_4_;
  auVar93 = vdpps_avx(auVar180,auVar180,0x7f);
  auVar290 = vshufps_avx(auVar320,auVar320,0xc9);
  auVar85._0_4_ = fVar254 * auVar290._0_4_;
  auVar85._4_4_ = fVar200 * auVar290._4_4_;
  auVar85._8_4_ = fVar202 * auVar290._8_4_;
  auVar85._12_4_ = fVar235 * auVar290._12_4_;
  auVar74 = vsubps_avx(auVar217,auVar85);
  fVar119 = auVar93._0_4_;
  auVar76 = ZEXT416((uint)fVar119);
  auVar290 = vrsqrtss_avx(auVar76,auVar76);
  fVar152 = auVar290._0_4_;
  auVar320 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar290 = vdpps_avx(auVar180,auVar320,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar193._0_4_ = auVar93._0_4_ * auVar320._0_4_;
  auVar193._4_4_ = auVar93._4_4_ * auVar320._4_4_;
  auVar193._8_4_ = auVar93._8_4_ * auVar320._8_4_;
  auVar193._12_4_ = auVar93._12_4_ * auVar320._12_4_;
  auVar93 = vshufps_avx(auVar290,auVar290,0);
  auVar349._0_4_ = auVar93._0_4_ * auVar180._0_4_;
  auVar349._4_4_ = auVar93._4_4_ * auVar180._4_4_;
  auVar349._8_4_ = auVar93._8_4_ * auVar180._8_4_;
  auVar349._12_4_ = auVar93._12_4_ * auVar180._12_4_;
  auVar75 = vsubps_avx(auVar193,auVar349);
  auVar93 = vrcpss_avx(auVar76,auVar76);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar119 * auVar93._0_4_)));
  auVar320 = vshufps_avx(auVar93,auVar93,0);
  auVar15 = vshufps_avx(auVar211,auVar211,0xc9);
  auVar93 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar290 = ZEXT416((uint)(fVar152 * 1.5 - fVar119 * 0.5 * fVar152 * fVar152 * fVar152));
  auVar211 = vshufps_avx(auVar290,auVar290,0);
  fVar119 = auVar180._0_4_ * auVar211._0_4_;
  fVar152 = auVar180._4_4_ * auVar211._4_4_;
  fVar153 = auVar180._8_4_ * auVar211._8_4_;
  fVar185 = auVar180._12_4_ * auVar211._12_4_;
  fVar198 = auVar93._0_4_;
  auVar76 = ZEXT416((uint)fVar198);
  auVar290 = vrsqrtss_avx(auVar76,auVar76);
  fVar199 = auVar290._0_4_;
  auVar180 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar290 = vdpps_avx(auVar15,auVar180,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar86._0_4_ = auVar93._0_4_ * auVar180._0_4_;
  auVar86._4_4_ = auVar93._4_4_ * auVar180._4_4_;
  auVar86._8_4_ = auVar93._8_4_ * auVar180._8_4_;
  auVar86._12_4_ = auVar93._12_4_ * auVar180._12_4_;
  auVar93 = vshufps_avx(auVar290,auVar290,0);
  auVar350._0_4_ = auVar93._0_4_ * auVar15._0_4_;
  auVar350._4_4_ = auVar93._4_4_ * auVar15._4_4_;
  auVar350._8_4_ = auVar93._8_4_ * auVar15._8_4_;
  auVar350._12_4_ = auVar93._12_4_ * auVar15._12_4_;
  auVar74 = vsubps_avx(auVar86,auVar350);
  auVar93 = vrcpss_avx(auVar76,auVar76);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar198 * auVar93._0_4_)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar290 = ZEXT416((uint)(fVar199 * 1.5 - fVar198 * 0.5 * fVar199 * fVar199 * fVar199));
  auVar290 = vshufps_avx(auVar290,auVar290,0);
  fVar198 = auVar15._0_4_ * auVar290._0_4_;
  fVar199 = auVar15._4_4_ * auVar290._4_4_;
  fVar201 = auVar15._8_4_ * auVar290._8_4_;
  fVar204 = auVar15._12_4_ * auVar290._12_4_;
  auVar180 = vshufps_avx(auVar170,auVar170,0xff);
  auVar15 = vshufps_avx(_local_700,_local_700,0xff);
  auVar127._0_4_ = auVar15._0_4_ * fVar119;
  auVar127._4_4_ = auVar15._4_4_ * fVar152;
  auVar127._8_4_ = auVar15._8_4_ * fVar153;
  auVar127._12_4_ = auVar15._12_4_ * fVar185;
  auVar163._0_4_ =
       auVar180._0_4_ * fVar119 + auVar15._0_4_ * auVar211._0_4_ * auVar75._0_4_ * auVar320._0_4_;
  auVar163._4_4_ =
       auVar180._4_4_ * fVar152 + auVar15._4_4_ * auVar211._4_4_ * auVar75._4_4_ * auVar320._4_4_;
  auVar163._8_4_ =
       auVar180._8_4_ * fVar153 + auVar15._8_4_ * auVar211._8_4_ * auVar75._8_4_ * auVar320._8_4_;
  auVar163._12_4_ =
       auVar180._12_4_ * fVar185 +
       auVar15._12_4_ * auVar211._12_4_ * auVar75._12_4_ * auVar320._12_4_;
  auVar15 = vsubps_avx(_local_700,auVar127);
  local_700._0_4_ = (float)local_700._0_4_ + auVar127._0_4_;
  local_700._4_4_ = (float)local_700._4_4_ + auVar127._4_4_;
  fStack_6f8 = fStack_6f8 + auVar127._8_4_;
  fStack_6f4 = fStack_6f4 + auVar127._12_4_;
  auVar211 = vsubps_avx(auVar170,auVar163);
  auVar180 = vshufps_avx(auVar16,auVar16,0xff);
  auVar320 = vshufps_avx(auVar338,auVar338,0xff);
  auVar218._0_4_ = auVar320._0_4_ * fVar198;
  auVar218._4_4_ = auVar320._4_4_ * fVar199;
  auVar218._8_4_ = auVar320._8_4_ * fVar201;
  auVar218._12_4_ = auVar320._12_4_ * fVar204;
  auVar164._0_4_ =
       auVar180._0_4_ * fVar198 + auVar320._0_4_ * auVar290._0_4_ * auVar74._0_4_ * auVar93._0_4_;
  auVar164._4_4_ =
       auVar180._4_4_ * fVar199 + auVar320._4_4_ * auVar290._4_4_ * auVar74._4_4_ * auVar93._4_4_;
  auVar164._8_4_ =
       auVar180._8_4_ * fVar201 + auVar320._8_4_ * auVar290._8_4_ * auVar74._8_4_ * auVar93._8_4_;
  auVar164._12_4_ =
       auVar180._12_4_ * fVar204 +
       auVar320._12_4_ * auVar290._12_4_ * auVar74._12_4_ * auVar93._12_4_;
  auVar180 = vsubps_avx(auVar338,auVar218);
  auVar351._0_4_ = auVar338._0_4_ + auVar218._0_4_;
  auVar351._4_4_ = auVar338._4_4_ + auVar218._4_4_;
  auVar351._8_4_ = auVar338._8_4_ + auVar218._8_4_;
  auVar351._12_4_ = auVar338._12_4_ + auVar218._12_4_;
  auVar320 = vsubps_avx(auVar16,auVar164);
  local_620 = auVar142._0_4_;
  fStack_61c = auVar142._4_4_;
  fStack_618 = auVar142._8_4_;
  fStack_614 = auVar142._12_4_;
  local_600 = auVar266._0_4_;
  fStack_5fc = auVar266._4_4_;
  fStack_5f8 = auVar266._8_4_;
  fStack_5f4 = auVar266._12_4_;
  auVar93 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
  auVar290 = vshufps_avx(ZEXT416((uint)(1.0 - fVar118)),ZEXT416((uint)(1.0 - fVar118)),0);
  fVar185 = auVar93._0_4_;
  fVar198 = auVar93._4_4_;
  fVar199 = auVar93._8_4_;
  fVar201 = auVar93._12_4_;
  fVar118 = auVar290._0_4_;
  fVar119 = auVar290._4_4_;
  fVar152 = auVar290._8_4_;
  fVar153 = auVar290._12_4_;
  local_4c0._0_4_ = fVar118 * local_600 + fVar185 * auVar15._0_4_;
  local_4c0._4_4_ = fVar119 * fStack_5fc + fVar198 * auVar15._4_4_;
  fStack_4b8 = fVar152 * fStack_5f8 + fVar199 * auVar15._8_4_;
  fStack_4b4 = fVar153 * fStack_5f4 + fVar201 * auVar15._12_4_;
  fVar240 = (local_600 + local_620 * 0.33333334) * fVar118 +
            (auVar15._0_4_ + auVar211._0_4_ * 0.33333334) * fVar185;
  fVar256 = (fStack_5fc + fStack_61c * 0.33333334) * fVar119 +
            (auVar15._4_4_ + auVar211._4_4_ * 0.33333334) * fVar198;
  fVar205 = (fStack_5f8 + fStack_618 * 0.33333334) * fVar152 +
            (auVar15._8_4_ + auVar211._8_4_ * 0.33333334) * fVar199;
  fVar239 = (fStack_5f4 + fStack_614 * 0.33333334) * fVar153 +
            (auVar15._12_4_ + auVar211._12_4_ * 0.33333334) * fVar201;
  local_680 = auVar131._0_4_;
  fStack_67c = auVar131._4_4_;
  fStack_678 = auVar131._8_4_;
  fStack_674 = auVar131._12_4_;
  auVar244._0_4_ = local_680 * 0.33333334;
  auVar244._4_4_ = fStack_67c * 0.33333334;
  auVar244._8_4_ = fStack_678 * 0.33333334;
  auVar244._12_4_ = fStack_674 * 0.33333334;
  auVar93 = vsubps_avx(auVar132,auVar244);
  auVar291._0_4_ = (fVar279 + auVar82._0_4_) * 0.33333334;
  auVar291._4_4_ = (fVar280 + auVar82._4_4_) * 0.33333334;
  auVar291._8_4_ = (fVar298 + auVar82._8_4_) * 0.33333334;
  auVar291._12_4_ = (fVar299 + auVar82._12_4_) * 0.33333334;
  auVar290 = vsubps_avx(_local_6b0,auVar291);
  auVar219._0_4_ = auVar320._0_4_ * 0.33333334;
  auVar219._4_4_ = auVar320._4_4_ * 0.33333334;
  auVar219._8_4_ = auVar320._8_4_ * 0.33333334;
  auVar219._12_4_ = auVar320._12_4_ * 0.33333334;
  auVar320 = vsubps_avx(auVar180,auVar219);
  auVar165._0_4_ = (fVar254 + auVar164._0_4_) * 0.33333334;
  auVar165._4_4_ = (fVar200 + auVar164._4_4_) * 0.33333334;
  auVar165._8_4_ = (fVar202 + auVar164._8_4_) * 0.33333334;
  auVar165._12_4_ = (fVar235 + auVar164._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar351,auVar165);
  local_4d0._0_4_ = fVar118 * auVar93._0_4_ + fVar185 * auVar320._0_4_;
  local_4d0._4_4_ = fVar119 * auVar93._4_4_ + fVar198 * auVar320._4_4_;
  fStack_4c8 = fVar152 * auVar93._8_4_ + fVar199 * auVar320._8_4_;
  fStack_4c4 = fVar153 * auVar93._12_4_ + fVar201 * auVar320._12_4_;
  local_4e0._0_4_ = auVar180._0_4_ * fVar185 + auVar132._0_4_ * fVar118;
  local_4e0._4_4_ = auVar180._4_4_ * fVar198 + auVar132._4_4_ * fVar119;
  fStack_4d8 = auVar180._8_4_ * fVar199 + auVar132._8_4_ * fVar152;
  fStack_4d4 = auVar180._12_4_ * fVar201 + auVar132._12_4_ * fVar153;
  local_4f0._0_4_ = fVar118 * (float)local_6e0._0_4_ + fVar185 * (float)local_700._0_4_;
  local_4f0._4_4_ = fVar119 * (float)local_6e0._4_4_ + fVar198 * (float)local_700._4_4_;
  fStack_4e8 = fVar152 * fStack_6d8 + fVar199 * fStack_6f8;
  fStack_4e4 = fVar153 * fStack_6d4 + fVar201 * fStack_6f4;
  fVar254 = fVar118 * ((float)local_6e0._0_4_ + (fVar116 + auVar212._0_4_) * 0.33333334) +
            ((fVar234 + auVar163._0_4_) * 0.33333334 + (float)local_700._0_4_) * fVar185;
  fVar200 = fVar119 * ((float)local_6e0._4_4_ + (fVar117 + auVar212._4_4_) * 0.33333334) +
            ((fVar236 + auVar163._4_4_) * 0.33333334 + (float)local_700._4_4_) * fVar198;
  fVar235 = fVar152 * (fStack_6d8 + (fVar203 + auVar212._8_4_) * 0.33333334) +
            ((fVar238 + auVar163._8_4_) * 0.33333334 + fStack_6f8) * fVar199;
  fVar112 = fVar153 * (fStack_6d4 + (fVar257 + auVar212._12_4_) * 0.33333334) +
            ((fVar255 + auVar163._12_4_) * 0.33333334 + fStack_6f4) * fVar201;
  fVar255 = auVar290._0_4_ * fVar118 + fVar185 * auVar15._0_4_;
  fVar202 = auVar290._4_4_ * fVar119 + fVar198 * auVar15._4_4_;
  fVar237 = auVar290._8_4_ * fVar152 + fVar199 * auVar15._8_4_;
  fVar113 = auVar290._12_4_ * fVar153 + fVar201 * auVar15._12_4_;
  local_500 = (float)local_6b0._0_4_ * fVar118 + auVar351._0_4_ * fVar185;
  fStack_4fc = (float)local_6b0._4_4_ * fVar119 + auVar351._4_4_ * fVar198;
  fStack_4f8 = fStack_6a8 * fVar152 + auVar351._8_4_ * fVar199;
  fStack_4f4 = fStack_6a4 * fVar153 + auVar351._12_4_ * fVar201;
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_380 = vsubps_avx(_local_4c0,auVar93);
  auVar180 = vmovsldup_avx(local_380);
  auVar290 = vmovshdup_avx(local_380);
  auVar320 = vshufps_avx(local_380,local_380,0xaa);
  fVar118 = pre->ray_space[k].vx.field_0.m128[0];
  fVar119 = pre->ray_space[k].vx.field_0.m128[1];
  fVar152 = pre->ray_space[k].vx.field_0.m128[2];
  fVar153 = pre->ray_space[k].vx.field_0.m128[3];
  fVar185 = pre->ray_space[k].vy.field_0.m128[0];
  fVar198 = pre->ray_space[k].vy.field_0.m128[1];
  fVar199 = pre->ray_space[k].vy.field_0.m128[2];
  fVar201 = pre->ray_space[k].vy.field_0.m128[3];
  fVar204 = pre->ray_space[k].vz.field_0.m128[0];
  fVar234 = pre->ray_space[k].vz.field_0.m128[1];
  fVar236 = pre->ray_space[k].vz.field_0.m128[2];
  fVar238 = pre->ray_space[k].vz.field_0.m128[3];
  auVar357._0_4_ = fVar118 * auVar180._0_4_ + fVar185 * auVar290._0_4_ + fVar204 * auVar320._0_4_;
  auVar357._4_4_ = fVar119 * auVar180._4_4_ + fVar198 * auVar290._4_4_ + fVar234 * auVar320._4_4_;
  auVar357._8_4_ = fVar152 * auVar180._8_4_ + fVar199 * auVar290._8_4_ + fVar236 * auVar320._8_4_;
  auVar357._12_4_ =
       fVar153 * auVar180._12_4_ + fVar201 * auVar290._12_4_ + fVar238 * auVar320._12_4_;
  auVar59._4_4_ = fVar256;
  auVar59._0_4_ = fVar240;
  auVar59._8_4_ = fVar205;
  auVar59._12_4_ = fVar239;
  local_390 = vsubps_avx(auVar59,auVar93);
  auVar320 = vshufps_avx(local_390,local_390,0xaa);
  auVar290 = vmovshdup_avx(local_390);
  auVar180 = vmovsldup_avx(local_390);
  auVar352._0_4_ = fVar118 * auVar180._0_4_ + fVar185 * auVar290._0_4_ + fVar204 * auVar320._0_4_;
  auVar352._4_4_ = fVar119 * auVar180._4_4_ + fVar198 * auVar290._4_4_ + fVar234 * auVar320._4_4_;
  auVar352._8_4_ = fVar152 * auVar180._8_4_ + fVar199 * auVar290._8_4_ + fVar236 * auVar320._8_4_;
  auVar352._12_4_ =
       fVar153 * auVar180._12_4_ + fVar201 * auVar290._12_4_ + fVar238 * auVar320._12_4_;
  local_3a0 = vsubps_avx(_local_4d0,auVar93);
  auVar320 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar290 = vmovshdup_avx(local_3a0);
  auVar180 = vmovsldup_avx(local_3a0);
  auVar339._0_4_ = fVar118 * auVar180._0_4_ + fVar185 * auVar290._0_4_ + fVar204 * auVar320._0_4_;
  auVar339._4_4_ = fVar119 * auVar180._4_4_ + fVar198 * auVar290._4_4_ + fVar234 * auVar320._4_4_;
  auVar339._8_4_ = fVar152 * auVar180._8_4_ + fVar199 * auVar290._8_4_ + fVar236 * auVar320._8_4_;
  auVar339._12_4_ =
       fVar153 * auVar180._12_4_ + fVar201 * auVar290._12_4_ + fVar238 * auVar320._12_4_;
  local_3b0 = vsubps_avx(_local_4e0,auVar93);
  auVar320 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar290 = vmovshdup_avx(local_3b0);
  auVar180 = vmovsldup_avx(local_3b0);
  auVar128._0_4_ = auVar180._0_4_ * fVar118 + auVar290._0_4_ * fVar185 + fVar204 * auVar320._0_4_;
  auVar128._4_4_ = auVar180._4_4_ * fVar119 + auVar290._4_4_ * fVar198 + fVar234 * auVar320._4_4_;
  auVar128._8_4_ = auVar180._8_4_ * fVar152 + auVar290._8_4_ * fVar199 + fVar236 * auVar320._8_4_;
  auVar128._12_4_ =
       auVar180._12_4_ * fVar153 + auVar290._12_4_ * fVar201 + fVar238 * auVar320._12_4_;
  local_3c0 = vsubps_avx(_local_4f0,auVar93);
  auVar320 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar290 = vmovshdup_avx(local_3c0);
  auVar180 = vmovsldup_avx(local_3c0);
  auVar292._0_4_ = auVar180._0_4_ * fVar118 + auVar290._0_4_ * fVar185 + auVar320._0_4_ * fVar204;
  auVar292._4_4_ = auVar180._4_4_ * fVar119 + auVar290._4_4_ * fVar198 + auVar320._4_4_ * fVar234;
  auVar292._8_4_ = auVar180._8_4_ * fVar152 + auVar290._8_4_ * fVar199 + auVar320._8_4_ * fVar236;
  auVar292._12_4_ =
       auVar180._12_4_ * fVar153 + auVar290._12_4_ * fVar201 + auVar320._12_4_ * fVar238;
  auVar57._4_4_ = fVar200;
  auVar57._0_4_ = fVar254;
  auVar57._8_4_ = fVar235;
  auVar57._12_4_ = fVar112;
  local_3d0 = vsubps_avx(auVar57,auVar93);
  auVar320 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar290 = vmovshdup_avx(local_3d0);
  auVar180 = vmovsldup_avx(local_3d0);
  auVar305._0_4_ = auVar180._0_4_ * fVar118 + auVar290._0_4_ * fVar185 + auVar320._0_4_ * fVar204;
  auVar305._4_4_ = auVar180._4_4_ * fVar119 + auVar290._4_4_ * fVar198 + auVar320._4_4_ * fVar234;
  auVar305._8_4_ = auVar180._8_4_ * fVar152 + auVar290._8_4_ * fVar199 + auVar320._8_4_ * fVar236;
  auVar305._12_4_ =
       auVar180._12_4_ * fVar153 + auVar290._12_4_ * fVar201 + auVar320._12_4_ * fVar238;
  auVar55._4_4_ = fVar202;
  auVar55._0_4_ = fVar255;
  auVar55._8_4_ = fVar237;
  auVar55._12_4_ = fVar113;
  local_3e0 = vsubps_avx(auVar55,auVar93);
  auVar320 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar290 = vmovshdup_avx(local_3e0);
  auVar180 = vmovsldup_avx(local_3e0);
  auVar322._0_4_ = auVar180._0_4_ * fVar118 + auVar290._0_4_ * fVar185 + auVar320._0_4_ * fVar204;
  auVar322._4_4_ = auVar180._4_4_ * fVar119 + auVar290._4_4_ * fVar198 + auVar320._4_4_ * fVar234;
  auVar322._8_4_ = auVar180._8_4_ * fVar152 + auVar290._8_4_ * fVar199 + auVar320._8_4_ * fVar236;
  auVar322._12_4_ =
       auVar180._12_4_ * fVar153 + auVar290._12_4_ * fVar201 + auVar320._12_4_ * fVar238;
  auVar61._4_4_ = fStack_4fc;
  auVar61._0_4_ = local_500;
  auVar61._8_4_ = fStack_4f8;
  auVar61._12_4_ = fStack_4f4;
  local_3f0 = vsubps_avx(auVar61,auVar93);
  auVar180 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar93 = vmovshdup_avx(local_3f0);
  auVar290 = vmovsldup_avx(local_3f0);
  auVar87._0_4_ = fVar118 * auVar290._0_4_ + fVar185 * auVar93._0_4_ + fVar204 * auVar180._0_4_;
  auVar87._4_4_ = fVar119 * auVar290._4_4_ + fVar198 * auVar93._4_4_ + fVar234 * auVar180._4_4_;
  auVar87._8_4_ = fVar152 * auVar290._8_4_ + fVar199 * auVar93._8_4_ + fVar236 * auVar180._8_4_;
  auVar87._12_4_ = fVar153 * auVar290._12_4_ + fVar201 * auVar93._12_4_ + fVar238 * auVar180._12_4_;
  auVar320 = vmovlhps_avx(auVar357,auVar292);
  auVar15 = vmovlhps_avx(auVar352,auVar305);
  auVar211 = vmovlhps_avx(auVar339,auVar322);
  _local_4a0 = vmovlhps_avx(auVar128,auVar87);
  auVar93 = vminps_avx(auVar320,auVar15);
  auVar290 = vminps_avx(auVar211,_local_4a0);
  auVar180 = vminps_avx(auVar93,auVar290);
  auVar93 = vmaxps_avx(auVar320,auVar15);
  auVar290 = vmaxps_avx(auVar211,_local_4a0);
  auVar93 = vmaxps_avx(auVar93,auVar290);
  auVar290 = vshufpd_avx(auVar180,auVar180,3);
  auVar180 = vminps_avx(auVar180,auVar290);
  auVar290 = vshufpd_avx(auVar93,auVar93,3);
  auVar290 = vmaxps_avx(auVar93,auVar290);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar180,auVar261);
  auVar290 = vandps_avx(auVar290,auVar261);
  auVar93 = vmaxps_avx(auVar93,auVar290);
  auVar290 = vmovshdup_avx(auVar93);
  auVar93 = vmaxss_avx(auVar290,auVar93);
  local_528 = uVar63 + 0xf;
  fVar118 = auVar93._0_4_ * 9.536743e-07;
  local_4b0 = ZEXT416((uint)fVar118);
  auVar93 = vshufps_avx(local_4b0,ZEXT416((uint)fVar118),0);
  local_1c0._16_16_ = auVar93;
  local_1c0._0_16_ = auVar93;
  auVar88._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
  auVar88._8_4_ = auVar93._8_4_ ^ 0x80000000;
  auVar88._12_4_ = auVar93._12_4_ ^ 0x80000000;
  local_340._16_16_ = auVar88;
  local_340._0_16_ = auVar88;
  auVar93 = vpshufd_avx(ZEXT416(uVar66),0);
  local_2e0._16_16_ = auVar93;
  local_2e0._0_16_ = auVar93;
  auVar93 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar68 * 4 + 6)),0);
  local_300._16_16_ = auVar93;
  local_300._0_16_ = auVar93;
  bVar73 = false;
  uVar72 = 0;
  fVar118 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar15,auVar320);
  _local_360 = vsubps_avx(auVar211,auVar15);
  _local_370 = vsubps_avx(_local_4a0,auVar211);
  _local_420 = vsubps_avx(_local_4f0,_local_4c0);
  auVar58._4_4_ = fVar200;
  auVar58._0_4_ = fVar254;
  auVar58._8_4_ = fVar235;
  auVar58._12_4_ = fVar112;
  auVar60._4_4_ = fVar256;
  auVar60._0_4_ = fVar240;
  auVar60._8_4_ = fVar205;
  auVar60._12_4_ = fVar239;
  _local_430 = vsubps_avx(auVar58,auVar60);
  auVar56._4_4_ = fVar202;
  auVar56._0_4_ = fVar255;
  auVar56._8_4_ = fVar237;
  auVar56._12_4_ = fVar113;
  _local_440 = vsubps_avx(auVar56,_local_4d0);
  _local_450 = vsubps_avx(auVar61,_local_4e0);
  auVar89 = ZEXT816(0x3f80000000000000);
  local_400 = auVar89;
LAB_00f5db54:
  do {
    auVar93 = vshufps_avx(auVar89,auVar89,0x50);
    auVar358._8_4_ = 0x3f800000;
    auVar358._0_8_ = 0x3f8000003f800000;
    auVar358._12_4_ = 0x3f800000;
    auVar362._16_4_ = 0x3f800000;
    auVar362._0_16_ = auVar358;
    auVar362._20_4_ = 0x3f800000;
    auVar362._24_4_ = 0x3f800000;
    auVar362._28_4_ = 0x3f800000;
    auVar290 = vsubps_avx(auVar358,auVar93);
    fVar119 = auVar93._0_4_;
    fVar152 = auVar93._4_4_;
    fVar153 = auVar93._8_4_;
    fVar185 = auVar93._12_4_;
    fVar198 = auVar290._0_4_;
    fVar199 = auVar290._4_4_;
    fVar201 = auVar290._8_4_;
    fVar204 = auVar290._12_4_;
    auVar194._0_4_ = auVar292._0_4_ * fVar119 + fVar198 * auVar357._0_4_;
    auVar194._4_4_ = auVar292._4_4_ * fVar152 + fVar199 * auVar357._4_4_;
    auVar194._8_4_ = auVar292._0_4_ * fVar153 + fVar201 * auVar357._0_4_;
    auVar194._12_4_ = auVar292._4_4_ * fVar185 + fVar204 * auVar357._4_4_;
    auVar166._0_4_ = auVar305._0_4_ * fVar119 + fVar198 * auVar352._0_4_;
    auVar166._4_4_ = auVar305._4_4_ * fVar152 + fVar199 * auVar352._4_4_;
    auVar166._8_4_ = auVar305._0_4_ * fVar153 + fVar201 * auVar352._0_4_;
    auVar166._12_4_ = auVar305._4_4_ * fVar185 + fVar204 * auVar352._4_4_;
    auVar276._0_4_ = auVar322._0_4_ * fVar119 + auVar339._0_4_ * fVar198;
    auVar276._4_4_ = auVar322._4_4_ * fVar152 + auVar339._4_4_ * fVar199;
    auVar276._8_4_ = auVar322._0_4_ * fVar153 + auVar339._0_4_ * fVar201;
    auVar276._12_4_ = auVar322._4_4_ * fVar185 + auVar339._4_4_ * fVar204;
    auVar220._0_4_ = auVar87._0_4_ * fVar119 + auVar128._0_4_ * fVar198;
    auVar220._4_4_ = auVar87._4_4_ * fVar152 + auVar128._4_4_ * fVar199;
    auVar220._8_4_ = auVar87._0_4_ * fVar153 + auVar128._0_4_ * fVar201;
    auVar220._12_4_ = auVar87._4_4_ * fVar185 + auVar128._4_4_ * fVar204;
    auVar93 = vmovshdup_avx(local_400);
    auVar290 = vshufps_avx(local_400,local_400,0);
    auVar311._16_16_ = auVar290;
    auVar311._0_16_ = auVar290;
    auVar180 = vshufps_avx(local_400,local_400,0x55);
    auVar106._16_16_ = auVar180;
    auVar106._0_16_ = auVar180;
    auVar105 = vsubps_avx(auVar106,auVar311);
    auVar180 = vshufps_avx(auVar194,auVar194,0);
    auVar142 = vshufps_avx(auVar194,auVar194,0x55);
    auVar131 = vshufps_avx(auVar166,auVar166,0);
    auVar170 = vshufps_avx(auVar166,auVar166,0x55);
    auVar132 = vshufps_avx(auVar276,auVar276,0);
    auVar266 = vshufps_avx(auVar276,auVar276,0x55);
    auVar16 = vshufps_avx(auVar220,auVar220,0);
    auVar74 = vshufps_avx(auVar220,auVar220,0x55);
    auVar93 = ZEXT416((uint)((auVar93._0_4_ - local_400._0_4_) * 0.04761905));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar325._0_4_ = auVar290._0_4_ + auVar105._0_4_ * 0.0;
    auVar325._4_4_ = auVar290._4_4_ + auVar105._4_4_ * 0.14285715;
    auVar325._8_4_ = auVar290._8_4_ + auVar105._8_4_ * 0.2857143;
    auVar325._12_4_ = auVar290._12_4_ + auVar105._12_4_ * 0.42857146;
    auVar325._16_4_ = auVar290._0_4_ + auVar105._16_4_ * 0.5714286;
    auVar325._20_4_ = auVar290._4_4_ + auVar105._20_4_ * 0.71428573;
    auVar325._24_4_ = auVar290._8_4_ + auVar105._24_4_ * 0.8571429;
    auVar325._28_4_ = auVar290._12_4_ + auVar105._28_4_;
    auVar17 = vsubps_avx(auVar362,auVar325);
    fVar119 = auVar131._0_4_;
    fVar153 = auVar131._4_4_;
    fVar198 = auVar131._8_4_;
    fVar201 = auVar131._12_4_;
    fVar303 = auVar17._0_4_;
    fVar313 = auVar17._4_4_;
    fVar314 = auVar17._8_4_;
    fVar315 = auVar17._12_4_;
    fVar316 = auVar17._16_4_;
    fVar317 = auVar17._20_4_;
    fVar318 = auVar17._24_4_;
    fVar299 = auVar170._0_4_;
    fVar300 = auVar170._4_4_;
    fVar301 = auVar170._8_4_;
    fVar302 = auVar170._12_4_;
    fVar355 = auVar142._12_4_ + 1.0;
    fVar257 = auVar132._0_4_;
    fVar279 = auVar132._4_4_;
    fVar280 = auVar132._8_4_;
    fVar298 = auVar132._12_4_;
    fVar234 = fVar257 * auVar325._0_4_ + fVar303 * fVar119;
    fVar236 = fVar279 * auVar325._4_4_ + fVar313 * fVar153;
    fVar238 = fVar280 * auVar325._8_4_ + fVar314 * fVar198;
    fVar114 = fVar298 * auVar325._12_4_ + fVar315 * fVar201;
    fVar115 = fVar257 * auVar325._16_4_ + fVar316 * fVar119;
    fVar116 = fVar279 * auVar325._20_4_ + fVar317 * fVar153;
    fVar117 = fVar280 * auVar325._24_4_ + fVar318 * fVar198;
    fVar152 = auVar266._0_4_;
    fVar185 = auVar266._4_4_;
    fVar199 = auVar266._8_4_;
    fVar204 = auVar266._12_4_;
    fVar333 = fVar299 * fVar303 + auVar325._0_4_ * fVar152;
    fVar341 = fVar300 * fVar313 + auVar325._4_4_ * fVar185;
    fVar342 = fVar301 * fVar314 + auVar325._8_4_ * fVar199;
    fVar343 = fVar302 * fVar315 + auVar325._12_4_ * fVar204;
    fVar344 = fVar299 * fVar316 + auVar325._16_4_ * fVar152;
    fVar345 = fVar300 * fVar317 + auVar325._20_4_ * fVar185;
    fVar346 = fVar301 * fVar318 + auVar325._24_4_ * fVar199;
    fVar347 = fVar302 + fVar201;
    auVar290 = vshufps_avx(auVar194,auVar194,0xaa);
    auVar131 = vshufps_avx(auVar194,auVar194,0xff);
    fVar203 = fVar298 + 0.0;
    auVar170 = vshufps_avx(auVar166,auVar166,0xaa);
    auVar132 = vshufps_avx(auVar166,auVar166,0xff);
    auVar232._0_4_ =
         fVar303 * (auVar325._0_4_ * fVar119 + fVar303 * auVar180._0_4_) + auVar325._0_4_ * fVar234;
    auVar232._4_4_ =
         fVar313 * (auVar325._4_4_ * fVar153 + fVar313 * auVar180._4_4_) + auVar325._4_4_ * fVar236;
    auVar232._8_4_ =
         fVar314 * (auVar325._8_4_ * fVar198 + fVar314 * auVar180._8_4_) + auVar325._8_4_ * fVar238;
    auVar232._12_4_ =
         fVar315 * (auVar325._12_4_ * fVar201 + fVar315 * auVar180._12_4_) +
         auVar325._12_4_ * fVar114;
    auVar232._16_4_ =
         fVar316 * (auVar325._16_4_ * fVar119 + fVar316 * auVar180._0_4_) +
         auVar325._16_4_ * fVar115;
    auVar232._20_4_ =
         fVar317 * (auVar325._20_4_ * fVar153 + fVar317 * auVar180._4_4_) +
         auVar325._20_4_ * fVar116;
    auVar232._24_4_ =
         fVar318 * (auVar325._24_4_ * fVar198 + fVar318 * auVar180._8_4_) +
         auVar325._24_4_ * fVar117;
    auVar232._28_4_ = auVar180._12_4_ + 1.0 + fVar204;
    auVar252._0_4_ =
         fVar303 * (fVar299 * auVar325._0_4_ + auVar142._0_4_ * fVar303) + auVar325._0_4_ * fVar333;
    auVar252._4_4_ =
         fVar313 * (fVar300 * auVar325._4_4_ + auVar142._4_4_ * fVar313) + auVar325._4_4_ * fVar341;
    auVar252._8_4_ =
         fVar314 * (fVar301 * auVar325._8_4_ + auVar142._8_4_ * fVar314) + auVar325._8_4_ * fVar342;
    auVar252._12_4_ =
         fVar315 * (fVar302 * auVar325._12_4_ + auVar142._12_4_ * fVar315) +
         auVar325._12_4_ * fVar343;
    auVar252._16_4_ =
         fVar316 * (fVar299 * auVar325._16_4_ + auVar142._0_4_ * fVar316) +
         auVar325._16_4_ * fVar344;
    auVar252._20_4_ =
         fVar317 * (fVar300 * auVar325._20_4_ + auVar142._4_4_ * fVar317) +
         auVar325._20_4_ * fVar345;
    auVar252._24_4_ =
         fVar318 * (fVar301 * auVar325._24_4_ + auVar142._8_4_ * fVar318) +
         auVar325._24_4_ * fVar346;
    auVar252._28_4_ = auVar74._12_4_ + fVar204;
    auVar107._0_4_ =
         fVar303 * fVar234 + auVar325._0_4_ * (fVar257 * fVar303 + auVar16._0_4_ * auVar325._0_4_);
    auVar107._4_4_ =
         fVar313 * fVar236 + auVar325._4_4_ * (fVar279 * fVar313 + auVar16._4_4_ * auVar325._4_4_);
    auVar107._8_4_ =
         fVar314 * fVar238 + auVar325._8_4_ * (fVar280 * fVar314 + auVar16._8_4_ * auVar325._8_4_);
    auVar107._12_4_ =
         fVar315 * fVar114 +
         auVar325._12_4_ * (fVar298 * fVar315 + auVar16._12_4_ * auVar325._12_4_);
    auVar107._16_4_ =
         fVar316 * fVar115 + auVar325._16_4_ * (fVar257 * fVar316 + auVar16._0_4_ * auVar325._16_4_)
    ;
    auVar107._20_4_ =
         fVar317 * fVar116 + auVar325._20_4_ * (fVar279 * fVar317 + auVar16._4_4_ * auVar325._20_4_)
    ;
    auVar107._24_4_ =
         fVar318 * fVar117 + auVar325._24_4_ * (fVar280 * fVar318 + auVar16._8_4_ * auVar325._24_4_)
    ;
    auVar107._28_4_ = fVar201 + 1.0 + fVar203;
    auVar332._0_4_ =
         fVar303 * fVar333 + auVar325._0_4_ * (auVar74._0_4_ * auVar325._0_4_ + fVar303 * fVar152);
    auVar332._4_4_ =
         fVar313 * fVar341 + auVar325._4_4_ * (auVar74._4_4_ * auVar325._4_4_ + fVar313 * fVar185);
    auVar332._8_4_ =
         fVar314 * fVar342 + auVar325._8_4_ * (auVar74._8_4_ * auVar325._8_4_ + fVar314 * fVar199);
    auVar332._12_4_ =
         fVar315 * fVar343 +
         auVar325._12_4_ * (auVar74._12_4_ * auVar325._12_4_ + fVar315 * fVar204);
    auVar332._16_4_ =
         fVar316 * fVar344 + auVar325._16_4_ * (auVar74._0_4_ * auVar325._16_4_ + fVar316 * fVar152)
    ;
    auVar332._20_4_ =
         fVar317 * fVar345 + auVar325._20_4_ * (auVar74._4_4_ * auVar325._20_4_ + fVar317 * fVar185)
    ;
    auVar332._24_4_ =
         fVar318 * fVar346 + auVar325._24_4_ * (auVar74._8_4_ * auVar325._24_4_ + fVar318 * fVar199)
    ;
    auVar332._28_4_ = fVar203 + fVar204 + 0.0;
    local_200._0_4_ = fVar303 * auVar232._0_4_ + auVar325._0_4_ * auVar107._0_4_;
    local_200._4_4_ = fVar313 * auVar232._4_4_ + auVar325._4_4_ * auVar107._4_4_;
    local_200._8_4_ = fVar314 * auVar232._8_4_ + auVar325._8_4_ * auVar107._8_4_;
    local_200._12_4_ = fVar315 * auVar232._12_4_ + auVar325._12_4_ * auVar107._12_4_;
    local_200._16_4_ = fVar316 * auVar232._16_4_ + auVar325._16_4_ * auVar107._16_4_;
    local_200._20_4_ = fVar317 * auVar232._20_4_ + auVar325._20_4_ * auVar107._20_4_;
    local_200._24_4_ = fVar318 * auVar232._24_4_ + auVar325._24_4_ * auVar107._24_4_;
    local_200._28_4_ = fVar347 + fVar204 + 0.0;
    auVar197._0_4_ = fVar303 * auVar252._0_4_ + auVar325._0_4_ * auVar332._0_4_;
    auVar197._4_4_ = fVar313 * auVar252._4_4_ + auVar325._4_4_ * auVar332._4_4_;
    auVar197._8_4_ = fVar314 * auVar252._8_4_ + auVar325._8_4_ * auVar332._8_4_;
    auVar197._12_4_ = fVar315 * auVar252._12_4_ + auVar325._12_4_ * auVar332._12_4_;
    auVar197._16_4_ = fVar316 * auVar252._16_4_ + auVar325._16_4_ * auVar332._16_4_;
    auVar197._20_4_ = fVar317 * auVar252._20_4_ + auVar325._20_4_ * auVar332._20_4_;
    auVar197._24_4_ = fVar318 * auVar252._24_4_ + auVar325._24_4_ * auVar332._24_4_;
    auVar197._28_4_ = fVar347 + fVar203;
    auVar18 = vsubps_avx(auVar107,auVar232);
    auVar105 = vsubps_avx(auVar332,auVar252);
    local_620 = auVar93._0_4_;
    fStack_61c = auVar93._4_4_;
    fStack_618 = auVar93._8_4_;
    fStack_614 = auVar93._12_4_;
    local_240 = local_620 * auVar18._0_4_ * 3.0;
    fStack_23c = fStack_61c * auVar18._4_4_ * 3.0;
    auVar19._4_4_ = fStack_23c;
    auVar19._0_4_ = local_240;
    fStack_238 = fStack_618 * auVar18._8_4_ * 3.0;
    auVar19._8_4_ = fStack_238;
    fStack_234 = fStack_614 * auVar18._12_4_ * 3.0;
    auVar19._12_4_ = fStack_234;
    fStack_230 = local_620 * auVar18._16_4_ * 3.0;
    auVar19._16_4_ = fStack_230;
    fStack_22c = fStack_61c * auVar18._20_4_ * 3.0;
    auVar19._20_4_ = fStack_22c;
    fStack_228 = fStack_618 * auVar18._24_4_ * 3.0;
    auVar19._24_4_ = fStack_228;
    auVar19._28_4_ = auVar18._28_4_;
    local_260 = local_620 * auVar105._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar105._4_4_ * 3.0;
    auVar20._4_4_ = fStack_25c;
    auVar20._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar105._8_4_ * 3.0;
    auVar20._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar105._12_4_ * 3.0;
    auVar20._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar105._16_4_ * 3.0;
    auVar20._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar105._20_4_ * 3.0;
    auVar20._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar105._24_4_ * 3.0;
    auVar20._24_4_ = fStack_248;
    auVar20._28_4_ = fVar347;
    auVar19 = vsubps_avx(local_200,auVar19);
    auVar105 = vperm2f128_avx(auVar19,auVar19,1);
    auVar105 = vshufps_avx(auVar105,auVar19,0x30);
    auVar105 = vshufps_avx(auVar19,auVar105,0x29);
    auVar20 = vsubps_avx(auVar197,auVar20);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar345 = auVar170._0_4_;
    fVar346 = auVar170._4_4_;
    fVar363 = auVar170._8_4_;
    fVar201 = auVar290._12_4_;
    fVar279 = auVar132._0_4_;
    fVar298 = auVar132._4_4_;
    fVar333 = auVar132._8_4_;
    fVar341 = auVar132._12_4_;
    auVar93 = vshufps_avx(auVar276,auVar276,0xaa);
    fVar119 = auVar93._0_4_;
    fVar153 = auVar93._4_4_;
    fVar198 = auVar93._8_4_;
    fVar204 = auVar93._12_4_;
    fVar238 = auVar325._0_4_ * fVar119 + fVar345 * fVar303;
    fVar114 = auVar325._4_4_ * fVar153 + fVar346 * fVar313;
    fVar115 = auVar325._8_4_ * fVar198 + fVar363 * fVar314;
    fVar116 = auVar325._12_4_ * fVar204 + auVar170._12_4_ * fVar315;
    fVar117 = auVar325._16_4_ * fVar119 + fVar345 * fVar316;
    fVar203 = auVar325._20_4_ * fVar153 + fVar346 * fVar317;
    fVar257 = auVar325._24_4_ * fVar198 + fVar363 * fVar318;
    auVar93 = vshufps_avx(auVar276,auVar276,0xff);
    fVar152 = auVar93._0_4_;
    fVar185 = auVar93._4_4_;
    fVar199 = auVar93._8_4_;
    fVar234 = auVar93._12_4_;
    fVar280 = auVar325._0_4_ * fVar152 + fVar279 * fVar303;
    fVar299 = auVar325._4_4_ * fVar185 + fVar298 * fVar313;
    fVar300 = auVar325._8_4_ * fVar199 + fVar333 * fVar314;
    fVar301 = auVar325._12_4_ * fVar234 + fVar341 * fVar315;
    fVar342 = auVar325._16_4_ * fVar152 + fVar279 * fVar316;
    fVar302 = auVar325._20_4_ * fVar185 + fVar298 * fVar317;
    fVar343 = auVar325._24_4_ * fVar199 + fVar333 * fVar318;
    auVar93 = vshufps_avx(auVar220,auVar220,0xaa);
    fVar344 = auVar93._12_4_ + fVar204;
    auVar180 = vshufps_avx(auVar220,auVar220,0xff);
    fVar236 = auVar180._12_4_;
    auVar108._0_4_ =
         fVar303 * (fVar345 * auVar325._0_4_ + fVar303 * auVar290._0_4_) + auVar325._0_4_ * fVar238;
    auVar108._4_4_ =
         fVar313 * (fVar346 * auVar325._4_4_ + fVar313 * auVar290._4_4_) + auVar325._4_4_ * fVar114;
    auVar108._8_4_ =
         fVar314 * (fVar363 * auVar325._8_4_ + fVar314 * auVar290._8_4_) + auVar325._8_4_ * fVar115;
    auVar108._12_4_ =
         fVar315 * (auVar170._12_4_ * auVar325._12_4_ + fVar315 * fVar201) +
         auVar325._12_4_ * fVar116;
    auVar108._16_4_ =
         fVar316 * (fVar345 * auVar325._16_4_ + fVar316 * auVar290._0_4_) +
         auVar325._16_4_ * fVar117;
    auVar108._20_4_ =
         fVar317 * (fVar346 * auVar325._20_4_ + fVar317 * auVar290._4_4_) +
         auVar325._20_4_ * fVar203;
    auVar108._24_4_ =
         fVar318 * (fVar363 * auVar325._24_4_ + fVar318 * auVar290._8_4_) +
         auVar325._24_4_ * fVar257;
    auVar108._28_4_ = auVar20._28_4_ + fVar201 + fVar236;
    auVar147._0_4_ =
         fVar303 * (fVar279 * auVar325._0_4_ + auVar131._0_4_ * fVar303) + auVar325._0_4_ * fVar280;
    auVar147._4_4_ =
         fVar313 * (fVar298 * auVar325._4_4_ + auVar131._4_4_ * fVar313) + auVar325._4_4_ * fVar299;
    auVar147._8_4_ =
         fVar314 * (fVar333 * auVar325._8_4_ + auVar131._8_4_ * fVar314) + auVar325._8_4_ * fVar300;
    auVar147._12_4_ =
         fVar315 * (fVar341 * auVar325._12_4_ + auVar131._12_4_ * fVar315) +
         auVar325._12_4_ * fVar301;
    auVar147._16_4_ =
         fVar316 * (fVar279 * auVar325._16_4_ + auVar131._0_4_ * fVar316) +
         auVar325._16_4_ * fVar342;
    auVar147._20_4_ =
         fVar317 * (fVar298 * auVar325._20_4_ + auVar131._4_4_ * fVar317) +
         auVar325._20_4_ * fVar302;
    auVar147._24_4_ =
         fVar318 * (fVar333 * auVar325._24_4_ + auVar131._8_4_ * fVar318) +
         auVar325._24_4_ * fVar343;
    auVar147._28_4_ = fVar201 + auVar19._28_4_ + fVar236;
    auVar19 = vperm2f128_avx(local_200,local_200,1);
    auVar19 = vshufps_avx(auVar19,local_200,0x30);
    auVar106 = vshufps_avx(local_200,auVar19,0x29);
    auVar253._0_4_ =
         auVar325._0_4_ * (auVar93._0_4_ * auVar325._0_4_ + fVar303 * fVar119) + fVar303 * fVar238;
    auVar253._4_4_ =
         auVar325._4_4_ * (auVar93._4_4_ * auVar325._4_4_ + fVar313 * fVar153) + fVar313 * fVar114;
    auVar253._8_4_ =
         auVar325._8_4_ * (auVar93._8_4_ * auVar325._8_4_ + fVar314 * fVar198) + fVar314 * fVar115;
    auVar253._12_4_ =
         auVar325._12_4_ * (auVar93._12_4_ * auVar325._12_4_ + fVar315 * fVar204) +
         fVar315 * fVar116;
    auVar253._16_4_ =
         auVar325._16_4_ * (auVar93._0_4_ * auVar325._16_4_ + fVar316 * fVar119) + fVar316 * fVar117
    ;
    auVar253._20_4_ =
         auVar325._20_4_ * (auVar93._4_4_ * auVar325._20_4_ + fVar317 * fVar153) + fVar317 * fVar203
    ;
    auVar253._24_4_ =
         auVar325._24_4_ * (auVar93._8_4_ * auVar325._24_4_ + fVar318 * fVar198) + fVar318 * fVar257
    ;
    auVar253._28_4_ = fVar344 + fVar355 + auVar252._28_4_;
    auVar297._0_4_ =
         fVar303 * fVar280 + auVar325._0_4_ * (auVar325._0_4_ * auVar180._0_4_ + fVar303 * fVar152);
    auVar297._4_4_ =
         fVar313 * fVar299 + auVar325._4_4_ * (auVar325._4_4_ * auVar180._4_4_ + fVar313 * fVar185);
    auVar297._8_4_ =
         fVar314 * fVar300 + auVar325._8_4_ * (auVar325._8_4_ * auVar180._8_4_ + fVar314 * fVar199);
    auVar297._12_4_ =
         fVar315 * fVar301 + auVar325._12_4_ * (auVar325._12_4_ * fVar236 + fVar315 * fVar234);
    auVar297._16_4_ =
         fVar316 * fVar342 +
         auVar325._16_4_ * (auVar325._16_4_ * auVar180._0_4_ + fVar316 * fVar152);
    auVar297._20_4_ =
         fVar317 * fVar302 +
         auVar325._20_4_ * (auVar325._20_4_ * auVar180._4_4_ + fVar317 * fVar185);
    auVar297._24_4_ =
         fVar318 * fVar343 +
         auVar325._24_4_ * (auVar325._24_4_ * auVar180._8_4_ + fVar318 * fVar199);
    auVar297._28_4_ = fVar355 + fVar341 + fVar236 + fVar234;
    auVar278._0_4_ = fVar303 * auVar108._0_4_ + auVar325._0_4_ * auVar253._0_4_;
    auVar278._4_4_ = fVar313 * auVar108._4_4_ + auVar325._4_4_ * auVar253._4_4_;
    auVar278._8_4_ = fVar314 * auVar108._8_4_ + auVar325._8_4_ * auVar253._8_4_;
    auVar278._12_4_ = fVar315 * auVar108._12_4_ + auVar325._12_4_ * auVar253._12_4_;
    auVar278._16_4_ = fVar316 * auVar108._16_4_ + auVar325._16_4_ * auVar253._16_4_;
    auVar278._20_4_ = fVar317 * auVar108._20_4_ + auVar325._20_4_ * auVar253._20_4_;
    auVar278._24_4_ = fVar318 * auVar108._24_4_ + auVar325._24_4_ * auVar253._24_4_;
    auVar278._28_4_ = fVar344 + fVar236 + fVar234;
    auVar312._0_4_ = fVar303 * auVar147._0_4_ + auVar325._0_4_ * auVar297._0_4_;
    auVar312._4_4_ = fVar313 * auVar147._4_4_ + auVar325._4_4_ * auVar297._4_4_;
    auVar312._8_4_ = fVar314 * auVar147._8_4_ + auVar325._8_4_ * auVar297._8_4_;
    auVar312._12_4_ = fVar315 * auVar147._12_4_ + auVar325._12_4_ * auVar297._12_4_;
    auVar312._16_4_ = fVar316 * auVar147._16_4_ + auVar325._16_4_ * auVar297._16_4_;
    auVar312._20_4_ = fVar317 * auVar147._20_4_ + auVar325._20_4_ * auVar297._20_4_;
    auVar312._24_4_ = fVar318 * auVar147._24_4_ + auVar325._24_4_ * auVar297._24_4_;
    auVar312._28_4_ = auVar17._28_4_ + auVar325._28_4_;
    auVar21 = vsubps_avx(auVar253,auVar108);
    auVar19 = vsubps_avx(auVar297,auVar147);
    local_280 = local_620 * auVar21._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_27c;
    auVar17._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_268;
    auVar17._28_4_ = auVar21._28_4_;
    local_2a0 = local_620 * auVar19._0_4_ * 3.0;
    fStack_29c = fStack_61c * auVar19._4_4_ * 3.0;
    auVar22._4_4_ = fStack_29c;
    auVar22._0_4_ = local_2a0;
    fStack_298 = fStack_618 * auVar19._8_4_ * 3.0;
    auVar22._8_4_ = fStack_298;
    fStack_294 = fStack_614 * auVar19._12_4_ * 3.0;
    auVar22._12_4_ = fStack_294;
    fStack_290 = local_620 * auVar19._16_4_ * 3.0;
    auVar22._16_4_ = fStack_290;
    fStack_28c = fStack_61c * auVar19._20_4_ * 3.0;
    auVar22._20_4_ = fStack_28c;
    fStack_288 = fStack_618 * auVar19._24_4_ * 3.0;
    auVar22._24_4_ = fStack_288;
    auVar22._28_4_ = auVar253._28_4_;
    auVar19 = vperm2f128_avx(auVar278,auVar278,1);
    auVar19 = vshufps_avx(auVar19,auVar278,0x30);
    auVar107 = vshufps_avx(auVar278,auVar19,0x29);
    auVar17 = vsubps_avx(auVar278,auVar17);
    auVar19 = vperm2f128_avx(auVar17,auVar17,1);
    auVar19 = vshufps_avx(auVar19,auVar17,0x30);
    auVar19 = vshufps_avx(auVar17,auVar19,0x29);
    auVar22 = vsubps_avx(auVar312,auVar22);
    auVar17 = vperm2f128_avx(auVar22,auVar22,1);
    auVar17 = vshufps_avx(auVar17,auVar22,0x30);
    auVar22 = vshufps_avx(auVar22,auVar17,0x29);
    auVar23 = vsubps_avx(auVar278,local_200);
    auVar108 = vsubps_avx(auVar107,auVar106);
    fVar119 = auVar108._0_4_ + auVar23._0_4_;
    fVar152 = auVar108._4_4_ + auVar23._4_4_;
    fVar153 = auVar108._8_4_ + auVar23._8_4_;
    fVar185 = auVar108._12_4_ + auVar23._12_4_;
    fVar198 = auVar108._16_4_ + auVar23._16_4_;
    fVar199 = auVar108._20_4_ + auVar23._20_4_;
    fVar201 = auVar108._24_4_ + auVar23._24_4_;
    auVar17 = vperm2f128_avx(auVar197,auVar197,1);
    auVar17 = vshufps_avx(auVar17,auVar197,0x30);
    local_220 = vshufps_avx(auVar197,auVar17,0x29);
    auVar17 = vperm2f128_avx(auVar312,auVar312,1);
    auVar17 = vshufps_avx(auVar17,auVar312,0x30);
    local_1e0 = vshufps_avx(auVar312,auVar17,0x29);
    auVar17 = vsubps_avx(auVar312,auVar197);
    auVar147 = vsubps_avx(local_1e0,local_220);
    fVar204 = auVar147._0_4_ + auVar17._0_4_;
    fVar234 = auVar147._4_4_ + auVar17._4_4_;
    fVar236 = auVar147._8_4_ + auVar17._8_4_;
    fVar238 = auVar147._12_4_ + auVar17._12_4_;
    fVar114 = auVar147._16_4_ + auVar17._16_4_;
    fVar115 = auVar147._20_4_ + auVar17._20_4_;
    fVar116 = auVar147._24_4_ + auVar17._24_4_;
    auVar24._4_4_ = fVar152 * auVar197._4_4_;
    auVar24._0_4_ = fVar119 * auVar197._0_4_;
    auVar24._8_4_ = fVar153 * auVar197._8_4_;
    auVar24._12_4_ = fVar185 * auVar197._12_4_;
    auVar24._16_4_ = fVar198 * auVar197._16_4_;
    auVar24._20_4_ = fVar199 * auVar197._20_4_;
    auVar24._24_4_ = fVar201 * auVar197._24_4_;
    auVar24._28_4_ = auVar17._28_4_;
    auVar25._4_4_ = fVar234 * local_200._4_4_;
    auVar25._0_4_ = fVar204 * local_200._0_4_;
    auVar25._8_4_ = fVar236 * local_200._8_4_;
    auVar25._12_4_ = fVar238 * local_200._12_4_;
    auVar25._16_4_ = fVar114 * local_200._16_4_;
    auVar25._20_4_ = fVar115 * local_200._20_4_;
    auVar25._24_4_ = fVar116 * local_200._24_4_;
    auVar25._28_4_ = fVar344;
    auVar24 = vsubps_avx(auVar24,auVar25);
    local_240 = local_200._0_4_ + local_240;
    fStack_23c = local_200._4_4_ + fStack_23c;
    fStack_238 = local_200._8_4_ + fStack_238;
    fStack_234 = local_200._12_4_ + fStack_234;
    fStack_230 = local_200._16_4_ + fStack_230;
    fStack_22c = local_200._20_4_ + fStack_22c;
    fStack_228 = local_200._24_4_ + fStack_228;
    fStack_224 = local_200._28_4_ + auVar18._28_4_;
    local_260 = local_260 + auVar197._0_4_;
    fStack_25c = fStack_25c + auVar197._4_4_;
    fStack_258 = fStack_258 + auVar197._8_4_;
    fStack_254 = fStack_254 + auVar197._12_4_;
    fStack_250 = fStack_250 + auVar197._16_4_;
    fStack_24c = fStack_24c + auVar197._20_4_;
    fStack_248 = fStack_248 + auVar197._24_4_;
    fStack_244 = fVar347 + auVar197._28_4_;
    auVar18._4_4_ = fVar152 * fStack_25c;
    auVar18._0_4_ = fVar119 * local_260;
    auVar18._8_4_ = fVar153 * fStack_258;
    auVar18._12_4_ = fVar185 * fStack_254;
    auVar18._16_4_ = fVar198 * fStack_250;
    auVar18._20_4_ = fVar199 * fStack_24c;
    auVar18._24_4_ = fVar201 * fStack_248;
    auVar18._28_4_ = fVar347;
    auVar26._4_4_ = fVar234 * fStack_23c;
    auVar26._0_4_ = fVar204 * local_240;
    auVar26._8_4_ = fVar236 * fStack_238;
    auVar26._12_4_ = fVar238 * fStack_234;
    auVar26._16_4_ = fVar114 * fStack_230;
    auVar26._20_4_ = fVar115 * fStack_22c;
    auVar26._24_4_ = fVar116 * fStack_228;
    auVar26._28_4_ = fVar347 + auVar197._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar26);
    local_660 = auVar20._0_4_;
    fStack_65c = auVar20._4_4_;
    fStack_658 = auVar20._8_4_;
    fStack_654 = auVar20._12_4_;
    fStack_650 = auVar20._16_4_;
    fStack_64c = auVar20._20_4_;
    fStack_648 = auVar20._24_4_;
    auVar27._4_4_ = fVar152 * fStack_65c;
    auVar27._0_4_ = fVar119 * local_660;
    auVar27._8_4_ = fVar153 * fStack_658;
    auVar27._12_4_ = fVar185 * fStack_654;
    auVar27._16_4_ = fVar198 * fStack_650;
    auVar27._20_4_ = fVar199 * fStack_64c;
    auVar27._24_4_ = fVar201 * fStack_648;
    auVar27._28_4_ = fVar347;
    local_6e0._0_4_ = auVar105._0_4_;
    local_6e0._4_4_ = auVar105._4_4_;
    fStack_6d8 = auVar105._8_4_;
    fStack_6d4 = auVar105._12_4_;
    fStack_6d0 = auVar105._16_4_;
    fStack_6cc = auVar105._20_4_;
    fStack_6c8 = auVar105._24_4_;
    auVar28._4_4_ = fVar234 * (float)local_6e0._4_4_;
    auVar28._0_4_ = fVar204 * (float)local_6e0._0_4_;
    auVar28._8_4_ = fVar236 * fStack_6d8;
    auVar28._12_4_ = fVar238 * fStack_6d4;
    auVar28._16_4_ = fVar114 * fStack_6d0;
    auVar28._20_4_ = fVar115 * fStack_6cc;
    auVar28._24_4_ = fVar116 * fStack_6c8;
    auVar28._28_4_ = local_200._28_4_;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_220._4_4_ * fVar152;
    auVar29._0_4_ = local_220._0_4_ * fVar119;
    auVar29._8_4_ = local_220._8_4_ * fVar153;
    auVar29._12_4_ = local_220._12_4_ * fVar185;
    auVar29._16_4_ = local_220._16_4_ * fVar198;
    auVar29._20_4_ = local_220._20_4_ * fVar199;
    auVar29._24_4_ = local_220._24_4_ * fVar201;
    auVar29._28_4_ = fVar347;
    auVar30._4_4_ = auVar106._4_4_ * fVar234;
    auVar30._0_4_ = auVar106._0_4_ * fVar204;
    auVar30._8_4_ = auVar106._8_4_ * fVar236;
    auVar30._12_4_ = auVar106._12_4_ * fVar238;
    auVar30._16_4_ = auVar106._16_4_ * fVar114;
    auVar30._20_4_ = auVar106._20_4_ * fVar115;
    auVar30._24_4_ = auVar106._24_4_ * fVar116;
    auVar30._28_4_ = local_220._28_4_;
    local_620 = auVar19._0_4_;
    fStack_61c = auVar19._4_4_;
    fStack_618 = auVar19._8_4_;
    fStack_614 = auVar19._12_4_;
    fStack_610 = auVar19._16_4_;
    fStack_60c = auVar19._20_4_;
    fStack_608 = auVar19._24_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar312._4_4_ * fVar152;
    auVar31._0_4_ = auVar312._0_4_ * fVar119;
    auVar31._8_4_ = auVar312._8_4_ * fVar153;
    auVar31._12_4_ = auVar312._12_4_ * fVar185;
    auVar31._16_4_ = auVar312._16_4_ * fVar198;
    auVar31._20_4_ = auVar312._20_4_ * fVar199;
    auVar31._24_4_ = auVar312._24_4_ * fVar201;
    auVar31._28_4_ = fVar347;
    auVar32._4_4_ = fVar234 * auVar278._4_4_;
    auVar32._0_4_ = fVar204 * auVar278._0_4_;
    auVar32._8_4_ = fVar236 * auVar278._8_4_;
    auVar32._12_4_ = fVar238 * auVar278._12_4_;
    auVar32._16_4_ = fVar114 * auVar278._16_4_;
    auVar32._20_4_ = fVar115 * auVar278._20_4_;
    auVar32._24_4_ = fVar116 * auVar278._24_4_;
    auVar32._28_4_ = fStack_224;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_280 = auVar278._0_4_ + local_280;
    fStack_27c = auVar278._4_4_ + fStack_27c;
    fStack_278 = auVar278._8_4_ + fStack_278;
    fStack_274 = auVar278._12_4_ + fStack_274;
    fStack_270 = auVar278._16_4_ + fStack_270;
    fStack_26c = auVar278._20_4_ + fStack_26c;
    fStack_268 = auVar278._24_4_ + fStack_268;
    fStack_264 = auVar278._28_4_ + auVar21._28_4_;
    local_2a0 = auVar312._0_4_ + local_2a0;
    fStack_29c = auVar312._4_4_ + fStack_29c;
    fStack_298 = auVar312._8_4_ + fStack_298;
    fStack_294 = auVar312._12_4_ + fStack_294;
    fStack_290 = auVar312._16_4_ + fStack_290;
    fStack_28c = auVar312._20_4_ + fStack_28c;
    fStack_288 = auVar312._24_4_ + fStack_288;
    fStack_284 = auVar312._28_4_ + auVar253._28_4_;
    auVar21._4_4_ = fVar152 * fStack_29c;
    auVar21._0_4_ = fVar119 * local_2a0;
    auVar21._8_4_ = fVar153 * fStack_298;
    auVar21._12_4_ = fVar185 * fStack_294;
    auVar21._16_4_ = fVar198 * fStack_290;
    auVar21._20_4_ = fVar199 * fStack_28c;
    auVar21._24_4_ = fVar201 * fStack_288;
    auVar21._28_4_ = auVar312._28_4_ + auVar253._28_4_;
    auVar33._4_4_ = fStack_27c * fVar234;
    auVar33._0_4_ = local_280 * fVar204;
    auVar33._8_4_ = fStack_278 * fVar236;
    auVar33._12_4_ = fStack_274 * fVar238;
    auVar33._16_4_ = fStack_270 * fVar114;
    auVar33._20_4_ = fStack_26c * fVar115;
    auVar33._24_4_ = fStack_268 * fVar116;
    auVar33._28_4_ = fStack_264;
    auVar21 = vsubps_avx(auVar21,auVar33);
    auVar34._4_4_ = fVar152 * auVar22._4_4_;
    auVar34._0_4_ = fVar119 * auVar22._0_4_;
    auVar34._8_4_ = fVar153 * auVar22._8_4_;
    auVar34._12_4_ = fVar185 * auVar22._12_4_;
    auVar34._16_4_ = fVar198 * auVar22._16_4_;
    auVar34._20_4_ = fVar199 * auVar22._20_4_;
    auVar34._24_4_ = fVar201 * auVar22._24_4_;
    auVar34._28_4_ = fStack_264;
    auVar35._4_4_ = fVar234 * fStack_61c;
    auVar35._0_4_ = fVar204 * local_620;
    auVar35._8_4_ = fVar236 * fStack_618;
    auVar35._12_4_ = fVar238 * fStack_614;
    auVar35._16_4_ = fVar114 * fStack_610;
    auVar35._20_4_ = fVar115 * fStack_60c;
    auVar35._24_4_ = fVar116 * fStack_608;
    auVar35._28_4_ = auVar22._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = fVar152 * local_1e0._4_4_;
    auVar36._0_4_ = fVar119 * local_1e0._0_4_;
    auVar36._8_4_ = fVar153 * local_1e0._8_4_;
    auVar36._12_4_ = fVar185 * local_1e0._12_4_;
    auVar36._16_4_ = fVar198 * local_1e0._16_4_;
    auVar36._20_4_ = fVar199 * local_1e0._20_4_;
    auVar36._24_4_ = fVar201 * local_1e0._24_4_;
    auVar36._28_4_ = auVar108._28_4_ + auVar23._28_4_;
    auVar23._4_4_ = auVar107._4_4_ * fVar234;
    auVar23._0_4_ = auVar107._0_4_ * fVar204;
    auVar23._8_4_ = auVar107._8_4_ * fVar236;
    auVar23._12_4_ = auVar107._12_4_ * fVar238;
    auVar23._16_4_ = auVar107._16_4_ * fVar114;
    auVar23._20_4_ = auVar107._20_4_ * fVar115;
    auVar23._24_4_ = auVar107._24_4_ * fVar116;
    auVar23._28_4_ = auVar147._28_4_ + auVar17._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar19 = vminps_avx(auVar24,auVar18);
    auVar105 = vmaxps_avx(auVar24,auVar18);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar25,auVar26);
    auVar105 = vmaxps_avx(auVar105,auVar19);
    auVar17 = vminps_avx(auVar27,auVar21);
    auVar19 = vmaxps_avx(auVar27,auVar21);
    auVar18 = vminps_avx(auVar28,auVar23);
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar28,auVar23);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar105,auVar19);
    auVar105 = vcmpps_avx(auVar18,local_1c0,2);
    auVar19 = vcmpps_avx(auVar19,local_340,5);
    auVar105 = vandps_avx(auVar19,auVar105);
    auVar19 = local_2c0 & auVar105;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar106,local_200);
      auVar20 = vsubps_avx(auVar107,auVar278);
      fVar152 = auVar19._0_4_ + auVar20._0_4_;
      fVar153 = auVar19._4_4_ + auVar20._4_4_;
      fVar185 = auVar19._8_4_ + auVar20._8_4_;
      fVar198 = auVar19._12_4_ + auVar20._12_4_;
      fVar199 = auVar19._16_4_ + auVar20._16_4_;
      fVar201 = auVar19._20_4_ + auVar20._20_4_;
      fVar204 = auVar19._24_4_ + auVar20._24_4_;
      auVar18 = vsubps_avx(local_220,auVar197);
      auVar21 = vsubps_avx(local_1e0,auVar312);
      fVar234 = auVar18._0_4_ + auVar21._0_4_;
      fVar236 = auVar18._4_4_ + auVar21._4_4_;
      fVar238 = auVar18._8_4_ + auVar21._8_4_;
      fVar114 = auVar18._12_4_ + auVar21._12_4_;
      fVar115 = auVar18._16_4_ + auVar21._16_4_;
      fVar116 = auVar18._20_4_ + auVar21._20_4_;
      fVar117 = auVar18._24_4_ + auVar21._24_4_;
      fVar119 = auVar21._28_4_;
      auVar37._4_4_ = auVar197._4_4_ * fVar153;
      auVar37._0_4_ = auVar197._0_4_ * fVar152;
      auVar37._8_4_ = auVar197._8_4_ * fVar185;
      auVar37._12_4_ = auVar197._12_4_ * fVar198;
      auVar37._16_4_ = auVar197._16_4_ * fVar199;
      auVar37._20_4_ = auVar197._20_4_ * fVar201;
      auVar37._24_4_ = auVar197._24_4_ * fVar204;
      auVar37._28_4_ = auVar197._28_4_;
      auVar38._4_4_ = local_200._4_4_ * fVar236;
      auVar38._0_4_ = local_200._0_4_ * fVar234;
      auVar38._8_4_ = local_200._8_4_ * fVar238;
      auVar38._12_4_ = local_200._12_4_ * fVar114;
      auVar38._16_4_ = local_200._16_4_ * fVar115;
      auVar38._20_4_ = local_200._20_4_ * fVar116;
      auVar38._24_4_ = local_200._24_4_ * fVar117;
      auVar38._28_4_ = local_200._28_4_;
      auVar21 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar153 * fStack_25c;
      auVar39._0_4_ = fVar152 * local_260;
      auVar39._8_4_ = fVar185 * fStack_258;
      auVar39._12_4_ = fVar198 * fStack_254;
      auVar39._16_4_ = fVar199 * fStack_250;
      auVar39._20_4_ = fVar201 * fStack_24c;
      auVar39._24_4_ = fVar204 * fStack_248;
      auVar39._28_4_ = auVar197._28_4_;
      auVar40._4_4_ = fVar236 * fStack_23c;
      auVar40._0_4_ = fVar234 * local_240;
      auVar40._8_4_ = fVar238 * fStack_238;
      auVar40._12_4_ = fVar114 * fStack_234;
      auVar40._16_4_ = fVar115 * fStack_230;
      auVar40._20_4_ = fVar116 * fStack_22c;
      auVar40._24_4_ = fVar117 * fStack_228;
      auVar40._28_4_ = fVar119;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar153 * fStack_65c;
      auVar41._0_4_ = fVar152 * local_660;
      auVar41._8_4_ = fVar185 * fStack_658;
      auVar41._12_4_ = fVar198 * fStack_654;
      auVar41._16_4_ = fVar199 * fStack_650;
      auVar41._20_4_ = fVar201 * fStack_64c;
      auVar41._24_4_ = fVar204 * fStack_648;
      auVar41._28_4_ = fVar119;
      auVar42._4_4_ = fVar236 * (float)local_6e0._4_4_;
      auVar42._0_4_ = fVar234 * (float)local_6e0._0_4_;
      auVar42._8_4_ = fVar238 * fStack_6d8;
      auVar42._12_4_ = fVar114 * fStack_6d4;
      auVar42._16_4_ = fVar115 * fStack_6d0;
      auVar42._20_4_ = fVar116 * fStack_6cc;
      auVar42._24_4_ = fVar117 * fStack_6c8;
      auVar42._28_4_ = auVar17._28_4_;
      auVar108 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_220._4_4_ * fVar153;
      auVar43._0_4_ = local_220._0_4_ * fVar152;
      auVar43._8_4_ = local_220._8_4_ * fVar185;
      auVar43._12_4_ = local_220._12_4_ * fVar198;
      auVar43._16_4_ = local_220._16_4_ * fVar199;
      auVar43._20_4_ = local_220._20_4_ * fVar201;
      auVar43._24_4_ = local_220._24_4_ * fVar204;
      auVar43._28_4_ = auVar17._28_4_;
      auVar44._4_4_ = auVar106._4_4_ * fVar236;
      auVar44._0_4_ = auVar106._0_4_ * fVar234;
      auVar44._8_4_ = auVar106._8_4_ * fVar238;
      auVar44._12_4_ = auVar106._12_4_ * fVar114;
      auVar44._16_4_ = auVar106._16_4_ * fVar115;
      auVar44._20_4_ = auVar106._20_4_ * fVar116;
      uVar6 = auVar106._28_4_;
      auVar44._24_4_ = auVar106._24_4_ * fVar117;
      auVar44._28_4_ = uVar6;
      auVar106 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar312._4_4_ * fVar153;
      auVar45._0_4_ = auVar312._0_4_ * fVar152;
      auVar45._8_4_ = auVar312._8_4_ * fVar185;
      auVar45._12_4_ = auVar312._12_4_ * fVar198;
      auVar45._16_4_ = auVar312._16_4_ * fVar199;
      auVar45._20_4_ = auVar312._20_4_ * fVar201;
      auVar45._24_4_ = auVar312._24_4_ * fVar204;
      auVar45._28_4_ = uVar6;
      auVar46._4_4_ = auVar278._4_4_ * fVar236;
      auVar46._0_4_ = auVar278._0_4_ * fVar234;
      auVar46._8_4_ = auVar278._8_4_ * fVar238;
      auVar46._12_4_ = auVar278._12_4_ * fVar114;
      auVar46._16_4_ = auVar278._16_4_ * fVar115;
      auVar46._20_4_ = auVar278._20_4_ * fVar116;
      auVar46._24_4_ = auVar278._24_4_ * fVar117;
      auVar46._28_4_ = auVar278._28_4_;
      auVar147 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar153 * fStack_29c;
      auVar47._0_4_ = fVar152 * local_2a0;
      auVar47._8_4_ = fVar185 * fStack_298;
      auVar47._12_4_ = fVar198 * fStack_294;
      auVar47._16_4_ = fVar199 * fStack_290;
      auVar47._20_4_ = fVar201 * fStack_28c;
      auVar47._24_4_ = fVar204 * fStack_288;
      auVar47._28_4_ = uVar6;
      auVar48._4_4_ = fVar236 * fStack_27c;
      auVar48._0_4_ = fVar234 * local_280;
      auVar48._8_4_ = fVar238 * fStack_278;
      auVar48._12_4_ = fVar114 * fStack_274;
      auVar48._16_4_ = fVar115 * fStack_270;
      auVar48._20_4_ = fVar116 * fStack_26c;
      auVar48._24_4_ = fVar117 * fStack_268;
      auVar48._28_4_ = auVar312._28_4_;
      auVar24 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar153 * auVar22._4_4_;
      auVar49._0_4_ = fVar152 * auVar22._0_4_;
      auVar49._8_4_ = fVar185 * auVar22._8_4_;
      auVar49._12_4_ = fVar198 * auVar22._12_4_;
      auVar49._16_4_ = fVar199 * auVar22._16_4_;
      auVar49._20_4_ = fVar201 * auVar22._20_4_;
      auVar49._24_4_ = fVar204 * auVar22._24_4_;
      auVar49._28_4_ = auVar312._28_4_;
      auVar50._4_4_ = fStack_61c * fVar236;
      auVar50._0_4_ = local_620 * fVar234;
      auVar50._8_4_ = fStack_618 * fVar238;
      auVar50._12_4_ = fStack_614 * fVar114;
      auVar50._16_4_ = fStack_610 * fVar115;
      auVar50._20_4_ = fStack_60c * fVar116;
      auVar50._24_4_ = fStack_608 * fVar117;
      auVar50._28_4_ = local_220._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_1e0._4_4_ * fVar153;
      auVar51._0_4_ = local_1e0._0_4_ * fVar152;
      auVar51._8_4_ = local_1e0._8_4_ * fVar185;
      auVar51._12_4_ = local_1e0._12_4_ * fVar198;
      auVar51._16_4_ = local_1e0._16_4_ * fVar199;
      auVar51._20_4_ = local_1e0._20_4_ * fVar201;
      auVar51._24_4_ = local_1e0._24_4_ * fVar204;
      auVar51._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar52._4_4_ = auVar107._4_4_ * fVar236;
      auVar52._0_4_ = auVar107._0_4_ * fVar234;
      auVar52._8_4_ = auVar107._8_4_ * fVar238;
      auVar52._12_4_ = auVar107._12_4_ * fVar114;
      auVar52._16_4_ = auVar107._16_4_ * fVar115;
      auVar52._20_4_ = auVar107._20_4_ * fVar116;
      auVar52._24_4_ = auVar107._24_4_ * fVar117;
      auVar52._28_4_ = auVar18._28_4_ + fVar119;
      auVar107 = vsubps_avx(auVar51,auVar52);
      auVar20 = vminps_avx(auVar21,auVar23);
      auVar19 = vmaxps_avx(auVar21,auVar23);
      auVar17 = vminps_avx(auVar108,auVar106);
      auVar17 = vminps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar108,auVar106);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar18 = vminps_avx(auVar147,auVar24);
      auVar20 = vmaxps_avx(auVar147,auVar24);
      auVar106 = vminps_avx(auVar22,auVar107);
      auVar18 = vminps_avx(auVar18,auVar106);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar107);
      auVar20 = vmaxps_avx(auVar20,auVar17);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar18,local_1c0,2);
      auVar20 = vcmpps_avx(auVar20,local_340,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar105 = vandps_avx(local_2c0,auVar105);
      auVar20 = auVar105 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar19,auVar105);
        uVar70 = vmovmskps_avx(auVar105);
        if (uVar70 != 0) {
          uVar67 = (ulong)uVar72;
          auStack_490[uVar67] = uVar70 & 0xff;
          uVar7 = vmovlps_avx(local_400);
          *(undefined8 *)(afStack_320 + uVar67 * 2) = uVar7;
          uVar64 = vmovlps_avx(auVar89);
          auStack_1a0[uVar67] = uVar64;
          uVar72 = uVar72 + 1;
        }
      }
    }
LAB_00f5e192:
    do {
      do {
        do {
          do {
            if (uVar72 == 0) {
              if (bVar73) {
                return bVar73;
              }
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar104._4_4_ = uVar6;
              auVar104._0_4_ = uVar6;
              auVar104._8_4_ = uVar6;
              auVar104._12_4_ = uVar6;
              auVar93 = vcmpps_avx(local_410,auVar104,2);
              uVar66 = vmovmskps_avx(auVar93);
              uVar63 = uVar63 & local_528 & uVar66;
              if (uVar63 == 0) {
                return bVar73;
              }
              goto LAB_00f5ce89;
            }
            uVar67 = (ulong)(uVar72 - 1);
            uVar70 = auStack_490[uVar67];
            fVar119 = afStack_320[uVar67 * 2];
            fVar152 = afStack_320[uVar67 * 2 + 1];
            auVar89._8_8_ = 0;
            auVar89._0_8_ = auStack_1a0[uVar67];
            uVar64 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_490[uVar67] = uVar70;
            if (uVar70 == 0) {
              uVar72 = uVar72 - 1;
            }
            fVar185 = (float)(uVar64 + 1) * 0.14285715;
            fVar153 = (1.0 - (float)uVar64 * 0.14285715) * fVar119 +
                      fVar152 * (float)uVar64 * 0.14285715;
            fVar119 = (1.0 - fVar185) * fVar119 + fVar152 * fVar185;
            fVar152 = fVar119 - fVar153;
            if (0.16666667 <= fVar152) {
              local_400 = vinsertps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar119),0x10);
              goto LAB_00f5db54;
            }
            auVar93 = vshufps_avx(auVar89,auVar89,0x50);
            auVar129._8_4_ = 0x3f800000;
            auVar129._0_8_ = 0x3f8000003f800000;
            auVar129._12_4_ = 0x3f800000;
            auVar290 = vsubps_avx(auVar129,auVar93);
            fVar185 = auVar93._0_4_;
            fVar198 = auVar93._4_4_;
            fVar199 = auVar93._8_4_;
            fVar201 = auVar93._12_4_;
            fVar204 = auVar290._0_4_;
            fVar234 = auVar290._4_4_;
            fVar236 = auVar290._8_4_;
            fVar238 = auVar290._12_4_;
            auVar167._0_4_ = fVar185 * auVar292._0_4_ + fVar204 * auVar357._0_4_;
            auVar167._4_4_ = fVar198 * auVar292._4_4_ + fVar234 * auVar357._4_4_;
            auVar167._8_4_ = fVar199 * auVar292._0_4_ + fVar236 * auVar357._0_4_;
            auVar167._12_4_ = fVar201 * auVar292._4_4_ + fVar238 * auVar357._4_4_;
            auVar221._0_4_ = fVar185 * auVar305._0_4_ + fVar204 * auVar352._0_4_;
            auVar221._4_4_ = fVar198 * auVar305._4_4_ + fVar234 * auVar352._4_4_;
            auVar221._8_4_ = fVar199 * auVar305._0_4_ + fVar236 * auVar352._0_4_;
            auVar221._12_4_ = fVar201 * auVar305._4_4_ + fVar238 * auVar352._4_4_;
            auVar245._0_4_ = fVar185 * auVar322._0_4_ + auVar339._0_4_ * fVar204;
            auVar245._4_4_ = fVar198 * auVar322._4_4_ + auVar339._4_4_ * fVar234;
            auVar245._8_4_ = fVar199 * auVar322._0_4_ + auVar339._0_4_ * fVar236;
            auVar245._12_4_ = fVar201 * auVar322._4_4_ + auVar339._4_4_ * fVar238;
            auVar90._0_4_ = fVar185 * auVar87._0_4_ + fVar204 * auVar128._0_4_;
            auVar90._4_4_ = fVar198 * auVar87._4_4_ + fVar234 * auVar128._4_4_;
            auVar90._8_4_ = fVar199 * auVar87._0_4_ + fVar236 * auVar128._0_4_;
            auVar90._12_4_ = fVar201 * auVar87._4_4_ + fVar238 * auVar128._4_4_;
            auVar148._16_16_ = auVar167;
            auVar148._0_16_ = auVar167;
            auVar182._16_16_ = auVar221;
            auVar182._0_16_ = auVar221;
            auVar233._16_16_ = auVar245;
            auVar233._0_16_ = auVar245;
            auVar105 = ZEXT2032(CONCAT416(fVar119,ZEXT416((uint)fVar153)));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar19 = vsubps_avx(auVar182,auVar148);
            fVar185 = auVar105._0_4_;
            fVar198 = auVar105._4_4_;
            fVar199 = auVar105._8_4_;
            fVar201 = auVar105._12_4_;
            fVar204 = auVar105._16_4_;
            fVar234 = auVar105._20_4_;
            fVar236 = auVar105._24_4_;
            auVar149._0_4_ = auVar167._0_4_ + auVar19._0_4_ * fVar185;
            auVar149._4_4_ = auVar167._4_4_ + auVar19._4_4_ * fVar198;
            auVar149._8_4_ = auVar167._8_4_ + auVar19._8_4_ * fVar199;
            auVar149._12_4_ = auVar167._12_4_ + auVar19._12_4_ * fVar201;
            auVar149._16_4_ = auVar167._0_4_ + auVar19._16_4_ * fVar204;
            auVar149._20_4_ = auVar167._4_4_ + auVar19._20_4_ * fVar234;
            auVar149._24_4_ = auVar167._8_4_ + auVar19._24_4_ * fVar236;
            auVar149._28_4_ = auVar167._12_4_ + auVar19._28_4_;
            auVar105 = vsubps_avx(auVar233,auVar182);
            auVar183._0_4_ = auVar221._0_4_ + auVar105._0_4_ * fVar185;
            auVar183._4_4_ = auVar221._4_4_ + auVar105._4_4_ * fVar198;
            auVar183._8_4_ = auVar221._8_4_ + auVar105._8_4_ * fVar199;
            auVar183._12_4_ = auVar221._12_4_ + auVar105._12_4_ * fVar201;
            auVar183._16_4_ = auVar221._0_4_ + auVar105._16_4_ * fVar204;
            auVar183._20_4_ = auVar221._4_4_ + auVar105._20_4_ * fVar234;
            auVar183._24_4_ = auVar221._8_4_ + auVar105._24_4_ * fVar236;
            auVar183._28_4_ = auVar221._12_4_ + auVar105._28_4_;
            auVar93 = vsubps_avx(auVar90,auVar245);
            auVar109._0_4_ = auVar245._0_4_ + auVar93._0_4_ * fVar185;
            auVar109._4_4_ = auVar245._4_4_ + auVar93._4_4_ * fVar198;
            auVar109._8_4_ = auVar245._8_4_ + auVar93._8_4_ * fVar199;
            auVar109._12_4_ = auVar245._12_4_ + auVar93._12_4_ * fVar201;
            auVar109._16_4_ = auVar245._0_4_ + auVar93._0_4_ * fVar204;
            auVar109._20_4_ = auVar245._4_4_ + auVar93._4_4_ * fVar234;
            auVar109._24_4_ = auVar245._8_4_ + auVar93._8_4_ * fVar236;
            auVar109._28_4_ = auVar245._12_4_ + auVar93._12_4_;
            auVar105 = vsubps_avx(auVar183,auVar149);
            auVar150._0_4_ = auVar149._0_4_ + fVar185 * auVar105._0_4_;
            auVar150._4_4_ = auVar149._4_4_ + fVar198 * auVar105._4_4_;
            auVar150._8_4_ = auVar149._8_4_ + fVar199 * auVar105._8_4_;
            auVar150._12_4_ = auVar149._12_4_ + fVar201 * auVar105._12_4_;
            auVar150._16_4_ = auVar149._16_4_ + fVar204 * auVar105._16_4_;
            auVar150._20_4_ = auVar149._20_4_ + fVar234 * auVar105._20_4_;
            auVar150._24_4_ = auVar149._24_4_ + fVar236 * auVar105._24_4_;
            auVar150._28_4_ = auVar149._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar109,auVar183);
            auVar110._0_4_ = auVar183._0_4_ + fVar185 * auVar105._0_4_;
            auVar110._4_4_ = auVar183._4_4_ + fVar198 * auVar105._4_4_;
            auVar110._8_4_ = auVar183._8_4_ + fVar199 * auVar105._8_4_;
            auVar110._12_4_ = auVar183._12_4_ + fVar201 * auVar105._12_4_;
            auVar110._16_4_ = auVar183._16_4_ + fVar204 * auVar105._16_4_;
            auVar110._20_4_ = auVar183._20_4_ + fVar234 * auVar105._20_4_;
            auVar110._24_4_ = auVar183._24_4_ + fVar236 * auVar105._24_4_;
            auVar110._28_4_ = auVar183._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar110,auVar150);
            auVar262._0_4_ = auVar150._0_4_ + fVar185 * auVar105._0_4_;
            auVar262._4_4_ = auVar150._4_4_ + fVar198 * auVar105._4_4_;
            auVar262._8_4_ = auVar150._8_4_ + fVar199 * auVar105._8_4_;
            auVar262._12_4_ = auVar150._12_4_ + fVar201 * auVar105._12_4_;
            auVar265._16_4_ = auVar150._16_4_ + fVar204 * auVar105._16_4_;
            auVar265._0_16_ = auVar262;
            auVar265._20_4_ = auVar150._20_4_ + fVar234 * auVar105._20_4_;
            auVar265._24_4_ = auVar150._24_4_ + fVar236 * auVar105._24_4_;
            auVar265._28_4_ = auVar150._28_4_ + auVar183._28_4_;
            auVar266 = auVar265._16_16_;
            auVar131 = vshufps_avx(ZEXT416((uint)(fVar152 * 0.33333334)),
                                   ZEXT416((uint)(fVar152 * 0.33333334)),0);
            auVar246._0_4_ = auVar262._0_4_ + auVar131._0_4_ * auVar105._0_4_ * 3.0;
            auVar246._4_4_ = auVar262._4_4_ + auVar131._4_4_ * auVar105._4_4_ * 3.0;
            auVar246._8_4_ = auVar262._8_4_ + auVar131._8_4_ * auVar105._8_4_ * 3.0;
            auVar246._12_4_ = auVar262._12_4_ + auVar131._12_4_ * auVar105._12_4_ * 3.0;
            auVar180 = vshufpd_avx(auVar262,auVar262,3);
            auVar142 = vshufpd_avx(auVar266,auVar266,3);
            auVar93 = vsubps_avx(auVar180,auVar262);
            auVar290 = vsubps_avx(auVar142,auVar266);
            auVar91._0_4_ = auVar93._0_4_ + auVar290._0_4_;
            auVar91._4_4_ = auVar93._4_4_ + auVar290._4_4_;
            auVar91._8_4_ = auVar93._8_4_ + auVar290._8_4_;
            auVar91._12_4_ = auVar93._12_4_ + auVar290._12_4_;
            auVar93 = vmovshdup_avx(auVar262);
            auVar290 = vmovshdup_avx(auVar246);
            auVar170 = vshufps_avx(auVar91,auVar91,0);
            auVar132 = vshufps_avx(auVar91,auVar91,0x55);
            fVar185 = auVar132._0_4_;
            fVar198 = auVar132._4_4_;
            fVar199 = auVar132._8_4_;
            fVar201 = auVar132._12_4_;
            fVar204 = auVar170._0_4_;
            fVar234 = auVar170._4_4_;
            fVar236 = auVar170._8_4_;
            fVar238 = auVar170._12_4_;
            auVar92._0_4_ = fVar204 * auVar262._0_4_ + auVar93._0_4_ * fVar185;
            auVar92._4_4_ = fVar234 * auVar262._4_4_ + auVar93._4_4_ * fVar198;
            auVar92._8_4_ = fVar236 * auVar262._8_4_ + auVar93._8_4_ * fVar199;
            auVar92._12_4_ = fVar238 * auVar262._12_4_ + auVar93._12_4_ * fVar201;
            auVar168._0_4_ = fVar204 * auVar246._0_4_ + auVar290._0_4_ * fVar185;
            auVar168._4_4_ = fVar234 * auVar246._4_4_ + auVar290._4_4_ * fVar198;
            auVar168._8_4_ = fVar236 * auVar246._8_4_ + auVar290._8_4_ * fVar199;
            auVar168._12_4_ = fVar238 * auVar246._12_4_ + auVar290._12_4_ * fVar201;
            auVar290 = vshufps_avx(auVar92,auVar92,0xe8);
            auVar170 = vshufps_avx(auVar168,auVar168,0xe8);
            auVar93 = vcmpps_avx(auVar290,auVar170,1);
            uVar70 = vextractps_avx(auVar93,0);
            auVar132 = auVar168;
            if ((uVar70 & 1) == 0) {
              auVar132 = auVar92;
            }
            auVar130._0_4_ = auVar131._0_4_ * auVar105._16_4_ * 3.0;
            auVar130._4_4_ = auVar131._4_4_ * auVar105._20_4_ * 3.0;
            auVar130._8_4_ = auVar131._8_4_ * auVar105._24_4_ * 3.0;
            auVar130._12_4_ = auVar131._12_4_ * 0.0;
            auVar74 = vsubps_avx(auVar266,auVar130);
            auVar131 = vmovshdup_avx(auVar74);
            auVar266 = vmovshdup_avx(auVar266);
            fVar114 = auVar74._0_4_;
            fVar115 = auVar74._4_4_;
            auVar222._0_4_ = fVar114 * fVar204 + auVar131._0_4_ * fVar185;
            auVar222._4_4_ = fVar115 * fVar234 + auVar131._4_4_ * fVar198;
            auVar222._8_4_ = auVar74._8_4_ * fVar236 + auVar131._8_4_ * fVar199;
            auVar222._12_4_ = auVar74._12_4_ * fVar238 + auVar131._12_4_ * fVar201;
            auVar247._0_4_ = fVar204 * auVar265._16_4_ + auVar266._0_4_ * fVar185;
            auVar247._4_4_ = fVar234 * auVar265._20_4_ + auVar266._4_4_ * fVar198;
            auVar247._8_4_ = fVar236 * auVar265._24_4_ + auVar266._8_4_ * fVar199;
            auVar247._12_4_ = fVar238 * auVar265._28_4_ + auVar266._12_4_ * fVar201;
            auVar266 = vshufps_avx(auVar222,auVar222,0xe8);
            auVar16 = vshufps_avx(auVar247,auVar247,0xe8);
            auVar131 = vcmpps_avx(auVar266,auVar16,1);
            uVar70 = vextractps_avx(auVar131,0);
            auVar75 = auVar247;
            if ((uVar70 & 1) == 0) {
              auVar75 = auVar222;
            }
            auVar132 = vmaxss_avx(auVar75,auVar132);
            auVar290 = vminps_avx(auVar290,auVar170);
            auVar170 = vminps_avx(auVar266,auVar16);
            auVar170 = vminps_avx(auVar290,auVar170);
            auVar93 = vshufps_avx(auVar93,auVar93,0x55);
            auVar93 = vblendps_avx(auVar93,auVar131,2);
            auVar131 = vpslld_avx(auVar93,0x1f);
            auVar93 = vshufpd_avx(auVar168,auVar168,1);
            auVar93 = vinsertps_avx(auVar93,auVar247,0x9c);
            auVar290 = vshufpd_avx(auVar92,auVar92,1);
            auVar290 = vinsertps_avx(auVar290,auVar222,0x9c);
            auVar93 = vblendvps_avx(auVar290,auVar93,auVar131);
            auVar290 = vmovshdup_avx(auVar93);
            auVar93 = vmaxss_avx(auVar290,auVar93);
            fVar199 = auVar170._0_4_;
            auVar290 = vmovshdup_avx(auVar170);
            fVar198 = auVar93._0_4_;
            fVar201 = auVar290._0_4_;
            fVar185 = auVar132._0_4_;
            if ((fVar199 < 0.0001) && (-0.0001 < fVar198)) break;
            if ((fVar201 < 0.0001 && -0.0001 < fVar185) || (fVar199 < 0.0001 && -0.0001 < fVar185))
            break;
            auVar131 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar93,1);
            auVar290 = vcmpps_avx(auVar290,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar290 = vandps_avx(auVar290,auVar131);
          } while ((auVar290 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar131 = vcmpps_avx(auVar170,_DAT_01f7aa10,1);
          auVar290 = vcmpss_avx(auVar132,ZEXT416(0),1);
          auVar169._8_4_ = 0x3f800000;
          auVar169._0_8_ = 0x3f8000003f800000;
          auVar169._12_4_ = 0x3f800000;
          auVar223._8_4_ = 0xbf800000;
          auVar223._0_8_ = 0xbf800000bf800000;
          auVar223._12_4_ = 0xbf800000;
          auVar290 = vblendvps_avx(auVar169,auVar223,auVar290);
          auVar131 = vblendvps_avx(auVar169,auVar223,auVar131);
          auVar170 = vcmpss_avx(auVar131,auVar290,4);
          auVar170 = vpshufd_avx(ZEXT416(auVar170._0_4_ & 1),0x50);
          auVar170 = vpslld_avx(auVar170,0x1f);
          auVar170 = vpsrad_avx(auVar170,0x1f);
          auVar170 = vpandn_avx(auVar170,_DAT_01fafeb0);
          auVar132 = vmovshdup_avx(auVar131);
          fVar204 = auVar132._0_4_;
          if ((auVar131._0_4_ != fVar204) || (NAN(auVar131._0_4_) || NAN(fVar204))) {
            if ((fVar201 != fVar199) || (NAN(fVar201) || NAN(fVar199))) {
              fVar199 = -fVar199 / (fVar201 - fVar199);
              auVar131 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar199) * 0.0 + fVar199)));
            }
            else {
              auVar131 = ZEXT816(0x3f80000000000000);
              if ((fVar199 != 0.0) || (NAN(fVar199))) {
                auVar131 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar266 = vcmpps_avx(auVar170,auVar131,1);
            auVar132 = vblendps_avx(auVar170,auVar131,2);
            auVar131 = vblendps_avx(auVar131,auVar170,2);
            auVar170 = vblendvps_avx(auVar131,auVar132,auVar266);
          }
          auVar93 = vcmpss_avx(auVar93,ZEXT416(0),1);
          auVar171._8_4_ = 0x3f800000;
          auVar171._0_8_ = 0x3f8000003f800000;
          auVar171._12_4_ = 0x3f800000;
          auVar224._8_4_ = 0xbf800000;
          auVar224._0_8_ = 0xbf800000bf800000;
          auVar224._12_4_ = 0xbf800000;
          auVar93 = vblendvps_avx(auVar171,auVar224,auVar93);
          fVar199 = auVar93._0_4_;
          if ((auVar290._0_4_ != fVar199) || (NAN(auVar290._0_4_) || NAN(fVar199))) {
            if ((fVar198 != fVar185) || (NAN(fVar198) || NAN(fVar185))) {
              fVar185 = -fVar185 / (fVar198 - fVar185);
              auVar93 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar185) * 0.0 + fVar185)));
            }
            else {
              auVar93 = ZEXT816(0x3f80000000000000);
              if ((fVar185 != 0.0) || (NAN(fVar185))) {
                auVar93 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar131 = vcmpps_avx(auVar170,auVar93,1);
            auVar290 = vblendps_avx(auVar170,auVar93,2);
            auVar93 = vblendps_avx(auVar93,auVar170,2);
            auVar170 = vblendvps_avx(auVar93,auVar290,auVar131);
          }
          if ((fVar204 != fVar199) || (NAN(fVar204) || NAN(fVar199))) {
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar93 = vcmpps_avx(auVar170,auVar94,1);
            auVar290 = vinsertps_avx(auVar170,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar172._4_12_ = auVar170._4_12_;
            auVar172._0_4_ = 0x3f800000;
            auVar170 = vblendvps_avx(auVar172,auVar290,auVar93);
          }
          auVar93 = vcmpps_avx(auVar170,_DAT_01f7b6f0,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar170._4_12_;
          auVar290 = vinsertps_avx(auVar170,ZEXT416(0x3f800000),0x10);
          auVar93 = vblendvps_avx(auVar290,auVar54 << 0x20,auVar93);
          auVar290 = vmovshdup_avx(auVar93);
        } while (auVar290._0_4_ < auVar93._0_4_);
        auVar95._0_4_ = auVar93._0_4_ + -0.1;
        auVar95._4_4_ = auVar93._4_4_ + 0.1;
        auVar95._8_4_ = auVar93._8_4_ + 0.0;
        auVar95._12_4_ = auVar93._12_4_ + 0.0;
        auVar131 = vshufpd_avx(auVar246,auVar246,3);
        auVar263._8_8_ = 0x3f80000000000000;
        auVar263._0_8_ = 0x3f80000000000000;
        auVar93 = vcmpps_avx(auVar95,auVar263,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar95._4_12_;
        auVar290 = vinsertps_avx(auVar95,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar93 = vblendvps_avx(auVar290,auVar53 << 0x20,auVar93);
        auVar290 = vshufpd_avx(auVar74,auVar74,3);
        auVar170 = vshufps_avx(auVar93,auVar93,0x50);
        auVar264._8_4_ = 0x3f800000;
        auVar264._0_8_ = 0x3f8000003f800000;
        auVar264._12_4_ = 0x3f800000;
        auVar132 = vsubps_avx(auVar264,auVar170);
        local_600 = auVar180._0_4_;
        fStack_5fc = auVar180._4_4_;
        fStack_5f8 = auVar180._8_4_;
        fStack_5f4 = auVar180._12_4_;
        fVar185 = auVar170._0_4_;
        fVar198 = auVar170._4_4_;
        fVar199 = auVar170._8_4_;
        fVar201 = auVar170._12_4_;
        local_680 = auVar142._0_4_;
        fStack_67c = auVar142._4_4_;
        fStack_678 = auVar142._8_4_;
        fStack_674 = auVar142._12_4_;
        fVar204 = auVar132._0_4_;
        fVar234 = auVar132._4_4_;
        fVar236 = auVar132._8_4_;
        fVar238 = auVar132._12_4_;
        auVar96._0_4_ = fVar185 * local_600 + fVar204 * auVar262._0_4_;
        auVar96._4_4_ = fVar198 * fStack_5fc + fVar234 * auVar262._4_4_;
        auVar96._8_4_ = fVar199 * fStack_5f8 + fVar236 * auVar262._0_4_;
        auVar96._12_4_ = fVar201 * fStack_5f4 + fVar238 * auVar262._4_4_;
        auVar173._0_4_ = fVar185 * auVar131._0_4_ + fVar204 * auVar246._0_4_;
        auVar173._4_4_ = fVar198 * auVar131._4_4_ + fVar234 * auVar246._4_4_;
        auVar173._8_4_ = fVar199 * auVar131._8_4_ + fVar236 * auVar246._0_4_;
        auVar173._12_4_ = fVar201 * auVar131._12_4_ + fVar238 * auVar246._4_4_;
        auVar248._0_4_ = fVar185 * auVar290._0_4_ + fVar204 * fVar114;
        auVar248._4_4_ = fVar198 * auVar290._4_4_ + fVar234 * fVar115;
        auVar248._8_4_ = fVar199 * auVar290._8_4_ + fVar236 * fVar114;
        auVar248._12_4_ = fVar201 * auVar290._12_4_ + fVar238 * fVar115;
        auVar277._0_4_ = fVar185 * local_680 + fVar204 * auVar265._16_4_;
        auVar277._4_4_ = fVar198 * fStack_67c + fVar234 * auVar265._20_4_;
        auVar277._8_4_ = fVar199 * fStack_678 + fVar236 * auVar265._16_4_;
        auVar277._12_4_ = fVar201 * fStack_674 + fVar238 * auVar265._20_4_;
        auVar142 = vsubps_avx(auVar264,auVar93);
        auVar290 = vmovshdup_avx(auVar89);
        auVar180 = vmovsldup_avx(auVar89);
        auVar89._0_4_ = auVar180._0_4_ * auVar142._0_4_ + auVar93._0_4_ * auVar290._0_4_;
        auVar89._4_4_ = auVar180._4_4_ * auVar142._4_4_ + auVar93._4_4_ * auVar290._4_4_;
        auVar89._8_4_ = auVar180._8_4_ * auVar142._8_4_ + auVar93._8_4_ * auVar290._8_4_;
        auVar89._12_4_ = auVar180._12_4_ * auVar142._12_4_ + auVar93._12_4_ * auVar290._12_4_;
        auVar74 = vmovshdup_avx(auVar89);
        auVar93 = vsubps_avx(auVar173,auVar96);
        auVar195._0_4_ = auVar93._0_4_ * 3.0;
        auVar195._4_4_ = auVar93._4_4_ * 3.0;
        auVar195._8_4_ = auVar93._8_4_ * 3.0;
        auVar195._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar248,auVar173);
        auVar293._0_4_ = auVar93._0_4_ * 3.0;
        auVar293._4_4_ = auVar93._4_4_ * 3.0;
        auVar293._8_4_ = auVar93._8_4_ * 3.0;
        auVar293._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar277,auVar248);
        auVar306._0_4_ = auVar93._0_4_ * 3.0;
        auVar306._4_4_ = auVar93._4_4_ * 3.0;
        auVar306._8_4_ = auVar93._8_4_ * 3.0;
        auVar306._12_4_ = auVar93._12_4_ * 3.0;
        auVar290 = vminps_avx(auVar293,auVar306);
        auVar93 = vmaxps_avx(auVar293,auVar306);
        auVar290 = vminps_avx(auVar195,auVar290);
        auVar93 = vmaxps_avx(auVar195,auVar93);
        auVar180 = vshufpd_avx(auVar290,auVar290,3);
        auVar142 = vshufpd_avx(auVar93,auVar93,3);
        auVar290 = vminps_avx(auVar290,auVar180);
        auVar93 = vmaxps_avx(auVar93,auVar142);
        auVar180 = vshufps_avx(ZEXT416((uint)(1.0 / fVar152)),ZEXT416((uint)(1.0 / fVar152)),0);
        auVar294._0_4_ = auVar290._0_4_ * auVar180._0_4_;
        auVar294._4_4_ = auVar290._4_4_ * auVar180._4_4_;
        auVar294._8_4_ = auVar290._8_4_ * auVar180._8_4_;
        auVar294._12_4_ = auVar290._12_4_ * auVar180._12_4_;
        auVar307._0_4_ = auVar180._0_4_ * auVar93._0_4_;
        auVar307._4_4_ = auVar180._4_4_ * auVar93._4_4_;
        auVar307._8_4_ = auVar180._8_4_ * auVar93._8_4_;
        auVar307._12_4_ = auVar180._12_4_ * auVar93._12_4_;
        auVar132 = ZEXT416((uint)(1.0 / (auVar74._0_4_ - auVar89._0_4_)));
        auVar93 = vshufpd_avx(auVar96,auVar96,3);
        auVar290 = vshufpd_avx(auVar173,auVar173,3);
        auVar180 = vshufpd_avx(auVar248,auVar248,3);
        auVar142 = vshufpd_avx(auVar277,auVar277,3);
        auVar93 = vsubps_avx(auVar93,auVar96);
        auVar131 = vsubps_avx(auVar290,auVar173);
        auVar170 = vsubps_avx(auVar180,auVar248);
        auVar142 = vsubps_avx(auVar142,auVar277);
        auVar290 = vminps_avx(auVar93,auVar131);
        auVar93 = vmaxps_avx(auVar93,auVar131);
        auVar180 = vminps_avx(auVar170,auVar142);
        auVar180 = vminps_avx(auVar290,auVar180);
        auVar290 = vmaxps_avx(auVar170,auVar142);
        auVar93 = vmaxps_avx(auVar93,auVar290);
        auVar290 = vshufps_avx(auVar132,auVar132,0);
        auVar353._0_4_ = auVar290._0_4_ * auVar180._0_4_;
        auVar353._4_4_ = auVar290._4_4_ * auVar180._4_4_;
        auVar353._8_4_ = auVar290._8_4_ * auVar180._8_4_;
        auVar353._12_4_ = auVar290._12_4_ * auVar180._12_4_;
        auVar359._0_4_ = auVar290._0_4_ * auVar93._0_4_;
        auVar359._4_4_ = auVar290._4_4_ * auVar93._4_4_;
        auVar359._8_4_ = auVar290._8_4_ * auVar93._8_4_;
        auVar359._12_4_ = auVar290._12_4_ * auVar93._12_4_;
        auVar93 = vmovsldup_avx(auVar89);
        auVar323._4_12_ = auVar93._4_12_;
        auVar323._0_4_ = fVar153;
        auVar328._4_12_ = auVar89._4_12_;
        auVar328._0_4_ = fVar119;
        auVar196._0_4_ = (fVar153 + fVar119) * 0.5;
        auVar196._4_4_ = (auVar93._4_4_ + auVar89._4_4_) * 0.5;
        auVar196._8_4_ = (auVar93._8_4_ + auVar89._8_4_) * 0.5;
        auVar196._12_4_ = (auVar93._12_4_ + auVar89._12_4_) * 0.5;
        auVar93 = vshufps_avx(auVar196,auVar196,0);
        fVar185 = auVar93._0_4_;
        fVar198 = auVar93._4_4_;
        fVar199 = auVar93._8_4_;
        fVar201 = auVar93._12_4_;
        local_6b0._0_4_ = auVar320._0_4_;
        local_6b0._4_4_ = auVar320._4_4_;
        fStack_6a8 = auVar320._8_4_;
        fStack_6a4 = auVar320._12_4_;
        auVar133._0_4_ = fVar185 * (float)local_350._0_4_ + (float)local_6b0._0_4_;
        auVar133._4_4_ = fVar198 * (float)local_350._4_4_ + (float)local_6b0._4_4_;
        auVar133._8_4_ = fVar199 * fStack_348 + fStack_6a8;
        auVar133._12_4_ = fVar201 * fStack_344 + fStack_6a4;
        local_630 = auVar15._0_4_;
        fStack_62c = auVar15._4_4_;
        fStack_628 = auVar15._8_4_;
        fStack_624 = auVar15._12_4_;
        auVar174._0_4_ = fVar185 * (float)local_360._0_4_ + local_630;
        auVar174._4_4_ = fVar198 * (float)local_360._4_4_ + fStack_62c;
        auVar174._8_4_ = fVar199 * fStack_358 + fStack_628;
        auVar174._12_4_ = fVar201 * fStack_354 + fStack_624;
        local_640 = auVar211._0_4_;
        fStack_63c = auVar211._4_4_;
        fStack_638 = auVar211._8_4_;
        fStack_634 = auVar211._12_4_;
        auVar249._0_4_ = fVar185 * (float)local_370._0_4_ + local_640;
        auVar249._4_4_ = fVar198 * (float)local_370._4_4_ + fStack_63c;
        auVar249._8_4_ = fVar199 * fStack_368 + fStack_638;
        auVar249._12_4_ = fVar201 * fStack_364 + fStack_634;
        auVar93 = vsubps_avx(auVar174,auVar133);
        auVar134._0_4_ = auVar133._0_4_ + fVar185 * auVar93._0_4_;
        auVar134._4_4_ = auVar133._4_4_ + fVar198 * auVar93._4_4_;
        auVar134._8_4_ = auVar133._8_4_ + fVar199 * auVar93._8_4_;
        auVar134._12_4_ = auVar133._12_4_ + fVar201 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar249,auVar174);
        auVar175._0_4_ = auVar174._0_4_ + fVar185 * auVar93._0_4_;
        auVar175._4_4_ = auVar174._4_4_ + fVar198 * auVar93._4_4_;
        auVar175._8_4_ = auVar174._8_4_ + fVar199 * auVar93._8_4_;
        auVar175._12_4_ = auVar174._12_4_ + fVar201 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar175,auVar134);
        fVar185 = auVar134._0_4_ + fVar185 * auVar93._0_4_;
        fVar198 = auVar134._4_4_ + fVar198 * auVar93._4_4_;
        auVar97._0_8_ = CONCAT44(fVar198,fVar185);
        auVar97._8_4_ = auVar134._8_4_ + fVar199 * auVar93._8_4_;
        auVar97._12_4_ = auVar134._12_4_ + fVar201 * auVar93._12_4_;
        fVar199 = auVar93._0_4_ * 3.0;
        fVar201 = auVar93._4_4_ * 3.0;
        auVar135._0_8_ = CONCAT44(fVar201,fVar199);
        auVar135._8_4_ = auVar93._8_4_ * 3.0;
        auVar135._12_4_ = auVar93._12_4_ * 3.0;
        auVar176._8_8_ = auVar97._0_8_;
        auVar176._0_8_ = auVar97._0_8_;
        auVar93 = vshufpd_avx(auVar97,auVar97,3);
        auVar290 = vshufps_avx(auVar196,auVar196,0x55);
        auVar170 = vsubps_avx(auVar93,auVar176);
        auVar340._0_4_ = auVar170._0_4_ * auVar290._0_4_ + fVar185;
        auVar340._4_4_ = auVar170._4_4_ * auVar290._4_4_ + fVar198;
        auVar340._8_4_ = auVar170._8_4_ * auVar290._8_4_ + fVar185;
        auVar340._12_4_ = auVar170._12_4_ * auVar290._12_4_ + fVar198;
        auVar177._8_8_ = auVar135._0_8_;
        auVar177._0_8_ = auVar135._0_8_;
        auVar93 = vshufpd_avx(auVar135,auVar135,1);
        auVar93 = vsubps_avx(auVar93,auVar177);
        auVar136._0_4_ = auVar93._0_4_ * auVar290._0_4_ + fVar199;
        auVar136._4_4_ = auVar93._4_4_ * auVar290._4_4_ + fVar201;
        auVar136._8_4_ = auVar93._8_4_ * auVar290._8_4_ + fVar199;
        auVar136._12_4_ = auVar93._12_4_ * auVar290._12_4_ + fVar201;
        auVar290 = vmovshdup_avx(auVar136);
        auVar250._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
        auVar250._8_4_ = auVar290._8_4_ ^ 0x80000000;
        auVar250._12_4_ = auVar290._12_4_ ^ 0x80000000;
        auVar180 = vmovshdup_avx(auVar170);
        auVar93 = vunpcklps_avx(auVar180,auVar250);
        auVar142 = vshufps_avx(auVar93,auVar250,4);
        auVar98._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
        auVar98._8_4_ = -auVar170._8_4_;
        auVar98._12_4_ = -auVar170._12_4_;
        auVar93 = vmovlhps_avx(auVar98,auVar136);
        auVar131 = vshufps_avx(auVar93,auVar136,8);
        auVar93 = ZEXT416((uint)(auVar136._0_4_ * auVar180._0_4_ - auVar170._0_4_ * auVar290._0_4_))
        ;
        auVar290 = vshufps_avx(auVar93,auVar93,0);
        auVar93 = vdivps_avx(auVar142,auVar290);
        auVar290 = vdivps_avx(auVar131,auVar290);
        auVar131 = vinsertps_avx(auVar294,auVar353,0x1c);
        auVar170 = vinsertps_avx(auVar307,auVar359,0x1c);
        auVar132 = vinsertps_avx(auVar353,auVar294,0x4c);
        auVar266 = vinsertps_avx(auVar359,auVar307,0x4c);
        auVar180 = vmovsldup_avx(auVar93);
        auVar308._0_4_ = auVar131._0_4_ * auVar180._0_4_;
        auVar308._4_4_ = auVar131._4_4_ * auVar180._4_4_;
        auVar308._8_4_ = auVar131._8_4_ * auVar180._8_4_;
        auVar308._12_4_ = auVar131._12_4_ * auVar180._12_4_;
        auVar137._0_4_ = auVar180._0_4_ * auVar170._0_4_;
        auVar137._4_4_ = auVar180._4_4_ * auVar170._4_4_;
        auVar137._8_4_ = auVar180._8_4_ * auVar170._8_4_;
        auVar137._12_4_ = auVar180._12_4_ * auVar170._12_4_;
        auVar142 = vminps_avx(auVar308,auVar137);
        auVar180 = vmaxps_avx(auVar137,auVar308);
        auVar16 = vmovsldup_avx(auVar290);
        auVar360._0_4_ = auVar16._0_4_ * auVar132._0_4_;
        auVar360._4_4_ = auVar16._4_4_ * auVar132._4_4_;
        auVar360._8_4_ = auVar16._8_4_ * auVar132._8_4_;
        auVar360._12_4_ = auVar16._12_4_ * auVar132._12_4_;
        auVar309._0_4_ = auVar16._0_4_ * auVar266._0_4_;
        auVar309._4_4_ = auVar16._4_4_ * auVar266._4_4_;
        auVar309._8_4_ = auVar16._8_4_ * auVar266._8_4_;
        auVar309._12_4_ = auVar16._12_4_ * auVar266._12_4_;
        auVar16 = vminps_avx(auVar360,auVar309);
        auVar225._0_4_ = auVar142._0_4_ + auVar16._0_4_;
        auVar225._4_4_ = auVar142._4_4_ + auVar16._4_4_;
        auVar225._8_4_ = auVar142._8_4_ + auVar16._8_4_;
        auVar225._12_4_ = auVar142._12_4_ + auVar16._12_4_;
        auVar142 = vmaxps_avx(auVar309,auVar360);
        auVar16 = vsubps_avx(auVar323,auVar196);
        auVar75 = vsubps_avx(auVar328,auVar196);
        auVar138._0_4_ = auVar142._0_4_ + auVar180._0_4_;
        auVar138._4_4_ = auVar142._4_4_ + auVar180._4_4_;
        auVar138._8_4_ = auVar142._8_4_ + auVar180._8_4_;
        auVar138._12_4_ = auVar142._12_4_ + auVar180._12_4_;
        auVar329._8_8_ = 0x3f800000;
        auVar329._0_8_ = 0x3f800000;
        auVar180 = vsubps_avx(auVar329,auVar138);
        auVar142 = vsubps_avx(auVar329,auVar225);
        fVar236 = auVar16._0_4_;
        auVar330._0_4_ = fVar236 * auVar180._0_4_;
        fVar238 = auVar16._4_4_;
        auVar330._4_4_ = fVar238 * auVar180._4_4_;
        fVar114 = auVar16._8_4_;
        auVar330._8_4_ = fVar114 * auVar180._8_4_;
        fVar115 = auVar16._12_4_;
        auVar330._12_4_ = fVar115 * auVar180._12_4_;
        fVar199 = auVar75._0_4_;
        auVar139._0_4_ = fVar199 * auVar180._0_4_;
        fVar201 = auVar75._4_4_;
        auVar139._4_4_ = fVar201 * auVar180._4_4_;
        fVar204 = auVar75._8_4_;
        auVar139._8_4_ = fVar204 * auVar180._8_4_;
        fVar234 = auVar75._12_4_;
        auVar139._12_4_ = fVar234 * auVar180._12_4_;
        auVar354._0_4_ = fVar236 * auVar142._0_4_;
        auVar354._4_4_ = fVar238 * auVar142._4_4_;
        auVar354._8_4_ = fVar114 * auVar142._8_4_;
        auVar354._12_4_ = fVar115 * auVar142._12_4_;
        auVar226._0_4_ = fVar199 * auVar142._0_4_;
        auVar226._4_4_ = fVar201 * auVar142._4_4_;
        auVar226._8_4_ = fVar204 * auVar142._8_4_;
        auVar226._12_4_ = fVar234 * auVar142._12_4_;
        auVar180 = vminps_avx(auVar330,auVar354);
        auVar142 = vminps_avx(auVar139,auVar226);
        auVar16 = vminps_avx(auVar180,auVar142);
        auVar180 = vmaxps_avx(auVar354,auVar330);
        auVar142 = vmaxps_avx(auVar226,auVar139);
        auVar75 = vshufps_avx(auVar196,auVar196,0x54);
        auVar142 = vmaxps_avx(auVar142,auVar180);
        auVar76 = vshufps_avx(auVar340,auVar340,0);
        auVar120 = vshufps_avx(auVar340,auVar340,0x55);
        auVar180 = vhaddps_avx(auVar16,auVar16);
        auVar142 = vhaddps_avx(auVar142,auVar142);
        auVar227._0_4_ = auVar120._0_4_ * auVar290._0_4_ + auVar76._0_4_ * auVar93._0_4_;
        auVar227._4_4_ = auVar120._4_4_ * auVar290._4_4_ + auVar76._4_4_ * auVar93._4_4_;
        auVar227._8_4_ = auVar120._8_4_ * auVar290._8_4_ + auVar76._8_4_ * auVar93._8_4_;
        auVar227._12_4_ = auVar120._12_4_ * auVar290._12_4_ + auVar76._12_4_ * auVar93._12_4_;
        auVar16 = vsubps_avx(auVar75,auVar227);
        fVar185 = auVar16._0_4_ + auVar180._0_4_;
        fVar198 = auVar16._0_4_ + auVar142._0_4_;
        auVar180 = vmaxss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar185));
        auVar142 = vminss_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar119));
      } while (auVar142._0_4_ < auVar180._0_4_);
      auVar180 = vmovshdup_avx(auVar93);
      auVar228._0_4_ = auVar131._0_4_ * auVar180._0_4_;
      auVar228._4_4_ = auVar131._4_4_ * auVar180._4_4_;
      auVar228._8_4_ = auVar131._8_4_ * auVar180._8_4_;
      auVar228._12_4_ = auVar131._12_4_ * auVar180._12_4_;
      auVar140._0_4_ = auVar180._0_4_ * auVar170._0_4_;
      auVar140._4_4_ = auVar180._4_4_ * auVar170._4_4_;
      auVar140._8_4_ = auVar180._8_4_ * auVar170._8_4_;
      auVar140._12_4_ = auVar180._12_4_ * auVar170._12_4_;
      auVar142 = vminps_avx(auVar228,auVar140);
      auVar180 = vmaxps_avx(auVar140,auVar228);
      auVar131 = vmovshdup_avx(auVar290);
      auVar99._0_4_ = auVar131._0_4_ * auVar132._0_4_;
      auVar99._4_4_ = auVar131._4_4_ * auVar132._4_4_;
      auVar99._8_4_ = auVar131._8_4_ * auVar132._8_4_;
      auVar99._12_4_ = auVar131._12_4_ * auVar132._12_4_;
      auVar229._0_4_ = auVar266._0_4_ * auVar131._0_4_;
      auVar229._4_4_ = auVar266._4_4_ * auVar131._4_4_;
      auVar229._8_4_ = auVar266._8_4_ * auVar131._8_4_;
      auVar229._12_4_ = auVar266._12_4_ * auVar131._12_4_;
      auVar131 = vminps_avx(auVar99,auVar229);
      auVar178._0_4_ = auVar142._0_4_ + auVar131._0_4_;
      auVar178._4_4_ = auVar142._4_4_ + auVar131._4_4_;
      auVar178._8_4_ = auVar142._8_4_ + auVar131._8_4_;
      auVar178._12_4_ = auVar142._12_4_ + auVar131._12_4_;
      auVar142 = vmaxps_avx(auVar229,auVar99);
      auVar100._0_4_ = auVar180._0_4_ + auVar142._0_4_;
      auVar100._4_4_ = auVar180._4_4_ + auVar142._4_4_;
      auVar100._8_4_ = auVar180._8_4_ + auVar142._8_4_;
      auVar100._12_4_ = auVar180._12_4_ + auVar142._12_4_;
      auVar180 = vsubps_avx(auVar263,auVar100);
      auVar142 = vsubps_avx(auVar263,auVar178);
      auVar179._0_4_ = fVar236 * auVar180._0_4_;
      auVar179._4_4_ = fVar238 * auVar180._4_4_;
      auVar179._8_4_ = fVar114 * auVar180._8_4_;
      auVar179._12_4_ = fVar115 * auVar180._12_4_;
      auVar230._0_4_ = fVar236 * auVar142._0_4_;
      auVar230._4_4_ = fVar238 * auVar142._4_4_;
      auVar230._8_4_ = fVar114 * auVar142._8_4_;
      auVar230._12_4_ = fVar115 * auVar142._12_4_;
      auVar101._0_4_ = fVar199 * auVar180._0_4_;
      auVar101._4_4_ = fVar201 * auVar180._4_4_;
      auVar101._8_4_ = fVar204 * auVar180._8_4_;
      auVar101._12_4_ = fVar234 * auVar180._12_4_;
      auVar141._0_4_ = fVar199 * auVar142._0_4_;
      auVar141._4_4_ = fVar201 * auVar142._4_4_;
      auVar141._8_4_ = fVar204 * auVar142._8_4_;
      auVar141._12_4_ = fVar234 * auVar142._12_4_;
      auVar180 = vminps_avx(auVar179,auVar230);
      auVar142 = vminps_avx(auVar101,auVar141);
      auVar180 = vminps_avx(auVar180,auVar142);
      auVar142 = vmaxps_avx(auVar230,auVar179);
      auVar131 = vmaxps_avx(auVar141,auVar101);
      auVar180 = vhaddps_avx(auVar180,auVar180);
      auVar142 = vmaxps_avx(auVar131,auVar142);
      auVar142 = vhaddps_avx(auVar142,auVar142);
      auVar131 = vmovshdup_avx(auVar16);
      auVar170 = ZEXT416((uint)(auVar131._0_4_ + auVar180._0_4_));
      auVar180 = vmaxss_avx(auVar89,auVar170);
      auVar131 = ZEXT416((uint)(auVar131._0_4_ + auVar142._0_4_));
      auVar142 = vminss_avx(auVar131,auVar74);
      auVar361._8_4_ = 0x7fffffff;
      auVar361._0_8_ = 0x7fffffff7fffffff;
      auVar361._12_4_ = 0x7fffffff;
    } while (auVar142._0_4_ < auVar180._0_4_);
    uVar70 = 0;
    if ((fVar153 < fVar185) && (fVar198 < fVar119)) {
      auVar180 = vcmpps_avx(auVar131,auVar74,1);
      auVar142 = vcmpps_avx(auVar89,auVar170,1);
      auVar180 = vandps_avx(auVar142,auVar180);
      uVar70 = auVar180._0_4_;
    }
    if ((3 < uVar72 || fVar152 < 0.001) || (uVar70 & 1) != 0) {
      lVar68 = 200;
      do {
        fVar152 = auVar16._0_4_;
        fVar119 = 1.0 - fVar152;
        auVar180 = ZEXT416((uint)(fVar119 * fVar119 * fVar119));
        auVar180 = vshufps_avx(auVar180,auVar180,0);
        auVar142 = ZEXT416((uint)(fVar152 * 3.0 * fVar119 * fVar119));
        auVar142 = vshufps_avx(auVar142,auVar142,0);
        auVar131 = ZEXT416((uint)(fVar119 * fVar152 * fVar152 * 3.0));
        auVar131 = vshufps_avx(auVar131,auVar131,0);
        auVar170 = ZEXT416((uint)(fVar152 * fVar152 * fVar152));
        auVar170 = vshufps_avx(auVar170,auVar170,0);
        fVar119 = (float)local_6b0._0_4_ * auVar180._0_4_ +
                  local_630 * auVar142._0_4_ +
                  (float)local_4a0._0_4_ * auVar170._0_4_ + local_640 * auVar131._0_4_;
        fVar152 = (float)local_6b0._4_4_ * auVar180._4_4_ +
                  fStack_62c * auVar142._4_4_ +
                  (float)local_4a0._4_4_ * auVar170._4_4_ + fStack_63c * auVar131._4_4_;
        auVar102._0_8_ = CONCAT44(fVar152,fVar119);
        auVar102._8_4_ =
             fStack_6a8 * auVar180._8_4_ +
             fStack_628 * auVar142._8_4_ + fStack_498 * auVar170._8_4_ + fStack_638 * auVar131._8_4_
        ;
        auVar102._12_4_ =
             fStack_6a4 * auVar180._12_4_ +
             fStack_624 * auVar142._12_4_ +
             fStack_494 * auVar170._12_4_ + fStack_634 * auVar131._12_4_;
        auVar143._8_8_ = auVar102._0_8_;
        auVar143._0_8_ = auVar102._0_8_;
        auVar142 = vshufpd_avx(auVar102,auVar102,1);
        auVar180 = vmovshdup_avx(auVar16);
        auVar142 = vsubps_avx(auVar142,auVar143);
        auVar103._0_4_ = auVar180._0_4_ * auVar142._0_4_ + fVar119;
        auVar103._4_4_ = auVar180._4_4_ * auVar142._4_4_ + fVar152;
        auVar103._8_4_ = auVar180._8_4_ * auVar142._8_4_ + fVar119;
        auVar103._12_4_ = auVar180._12_4_ * auVar142._12_4_ + fVar152;
        auVar180 = vshufps_avx(auVar103,auVar103,0);
        auVar142 = vshufps_avx(auVar103,auVar103,0x55);
        auVar144._0_4_ = auVar93._0_4_ * auVar180._0_4_ + auVar290._0_4_ * auVar142._0_4_;
        auVar144._4_4_ = auVar93._4_4_ * auVar180._4_4_ + auVar290._4_4_ * auVar142._4_4_;
        auVar144._8_4_ = auVar93._8_4_ * auVar180._8_4_ + auVar290._8_4_ * auVar142._8_4_;
        auVar144._12_4_ = auVar93._12_4_ * auVar180._12_4_ + auVar290._12_4_ * auVar142._12_4_;
        auVar16 = vsubps_avx(auVar16,auVar144);
        auVar180 = vandps_avx(auVar361,auVar103);
        auVar142 = vshufps_avx(auVar180,auVar180,0xf5);
        auVar180 = vmaxss_avx(auVar142,auVar180);
        if (auVar180._0_4_ < (float)local_4b0._0_4_) {
          fVar119 = auVar16._0_4_;
          if ((0.0 <= fVar119) && (fVar119 <= 1.0)) {
            auVar93 = vmovshdup_avx(auVar16);
            fVar152 = auVar93._0_4_;
            if ((0.0 <= fVar152) && (fVar152 <= 1.0)) {
              auVar93 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar266 = vinsertps_avx(auVar93,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar93 = vdpps_avx(auVar266,local_380,0x7f);
              auVar290 = vdpps_avx(auVar266,local_390,0x7f);
              auVar180 = vdpps_avx(auVar266,local_3c0,0x7f);
              auVar142 = vdpps_avx(auVar266,local_3d0,0x7f);
              auVar131 = vdpps_avx(auVar266,local_3e0,0x7f);
              auVar170 = vdpps_avx(auVar266,local_3f0,0x7f);
              fVar201 = 1.0 - fVar152;
              auVar132 = vdpps_avx(auVar266,local_3a0,0x7f);
              auVar266 = vdpps_avx(auVar266,local_3b0,0x7f);
              fVar204 = 1.0 - fVar119;
              fVar153 = auVar16._4_4_;
              fVar185 = auVar16._8_4_;
              fVar198 = auVar16._12_4_;
              fVar199 = fVar204 * fVar119 * fVar119 * 3.0;
              auVar251._0_4_ = fVar119 * fVar119 * fVar119;
              auVar251._4_4_ = fVar153 * fVar153 * fVar153;
              auVar251._8_4_ = fVar185 * fVar185 * fVar185;
              auVar251._12_4_ = fVar198 * fVar198 * fVar198;
              fVar153 = fVar119 * 3.0 * fVar204 * fVar204;
              fVar185 = fVar204 * fVar204 * fVar204;
              fVar119 = (fVar201 * auVar93._0_4_ + fVar152 * auVar180._0_4_) * fVar185 +
                        (fVar201 * auVar290._0_4_ + fVar152 * auVar142._0_4_) * fVar153 +
                        fVar199 * (fVar201 * auVar132._0_4_ + fVar152 * auVar131._0_4_) +
                        auVar251._0_4_ * (auVar170._0_4_ * fVar152 + fVar201 * auVar266._0_4_);
              if ((fVar118 <= fVar119) &&
                 (fVar152 = *(float *)(ray + k * 4 + 0x100), fVar119 <= fVar152)) {
                pGVar9 = (context->scene->geometries).items[uVar66].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_00f5f188:
                  bVar65 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar65 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_f0 = vshufps_avx(auVar16,auVar16,0x55);
                  auVar295._8_4_ = 0x3f800000;
                  auVar295._0_8_ = 0x3f8000003f800000;
                  auVar295._12_4_ = 0x3f800000;
                  auVar93 = vsubps_avx(auVar295,local_f0);
                  fVar198 = local_f0._0_4_;
                  fVar201 = local_f0._4_4_;
                  fVar234 = local_f0._8_4_;
                  fVar236 = local_f0._12_4_;
                  fVar238 = auVar93._0_4_;
                  fVar114 = auVar93._4_4_;
                  fVar115 = auVar93._8_4_;
                  fVar116 = auVar93._12_4_;
                  auVar310._0_4_ =
                       fVar198 * (float)local_4f0._0_4_ + fVar238 * (float)local_4c0._0_4_;
                  auVar310._4_4_ =
                       fVar201 * (float)local_4f0._4_4_ + fVar114 * (float)local_4c0._4_4_;
                  auVar310._8_4_ = fVar234 * fStack_4e8 + fVar115 * fStack_4b8;
                  auVar310._12_4_ = fVar236 * fStack_4e4 + fVar116 * fStack_4b4;
                  auVar324._0_4_ = fVar198 * fVar254 + fVar238 * fVar240;
                  auVar324._4_4_ = fVar201 * fVar200 + fVar114 * fVar256;
                  auVar324._8_4_ = fVar234 * fVar235 + fVar115 * fVar205;
                  auVar324._12_4_ = fVar236 * fVar112 + fVar116 * fVar239;
                  auVar331._0_4_ = fVar198 * fVar255 + fVar238 * (float)local_4d0._0_4_;
                  auVar331._4_4_ = fVar201 * fVar202 + fVar114 * (float)local_4d0._4_4_;
                  auVar331._8_4_ = fVar234 * fVar237 + fVar115 * fStack_4c8;
                  auVar331._12_4_ = fVar236 * fVar113 + fVar116 * fStack_4c4;
                  auVar296._0_4_ = fVar198 * local_500 + fVar238 * (float)local_4e0._0_4_;
                  auVar296._4_4_ = fVar201 * fStack_4fc + fVar114 * (float)local_4e0._4_4_;
                  auVar296._8_4_ = fVar234 * fStack_4f8 + fVar115 * fStack_4d8;
                  auVar296._12_4_ = fVar236 * fStack_4f4 + fVar116 * fStack_4d4;
                  auVar142 = vsubps_avx(auVar324,auVar310);
                  auVar131 = vsubps_avx(auVar331,auVar324);
                  auVar170 = vsubps_avx(auVar296,auVar331);
                  local_110 = vshufps_avx(auVar16,auVar16,0);
                  fVar198 = local_110._0_4_;
                  fVar234 = local_110._4_4_;
                  fVar236 = local_110._8_4_;
                  fVar114 = local_110._12_4_;
                  auVar93 = vshufps_avx(ZEXT416((uint)fVar204),ZEXT416((uint)fVar204),0);
                  fVar201 = auVar93._0_4_;
                  fVar204 = auVar93._4_4_;
                  fVar238 = auVar93._8_4_;
                  fVar115 = auVar93._12_4_;
                  auVar93 = vshufps_avx(auVar251,auVar251,0);
                  auVar290 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
                  auVar180 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
                  auVar231._0_4_ =
                       ((auVar131._0_4_ * fVar201 + auVar170._0_4_ * fVar198) * fVar198 +
                       (auVar142._0_4_ * fVar201 + auVar131._0_4_ * fVar198) * fVar201) * 3.0;
                  auVar231._4_4_ =
                       ((auVar131._4_4_ * fVar204 + auVar170._4_4_ * fVar234) * fVar234 +
                       (auVar142._4_4_ * fVar204 + auVar131._4_4_ * fVar234) * fVar204) * 3.0;
                  auVar231._8_4_ =
                       ((auVar131._8_4_ * fVar238 + auVar170._8_4_ * fVar236) * fVar236 +
                       (auVar142._8_4_ * fVar238 + auVar131._8_4_ * fVar236) * fVar238) * 3.0;
                  auVar231._12_4_ =
                       ((auVar131._12_4_ * fVar115 + auVar170._12_4_ * fVar114) * fVar114 +
                       (auVar142._12_4_ * fVar115 + auVar131._12_4_ * fVar114) * fVar115) * 3.0;
                  auVar142 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
                  auVar145._0_4_ =
                       auVar142._0_4_ * (float)local_420._0_4_ +
                       auVar180._0_4_ * (float)local_430._0_4_ +
                       auVar93._0_4_ * (float)local_450._0_4_ +
                       auVar290._0_4_ * (float)local_440._0_4_;
                  auVar145._4_4_ =
                       auVar142._4_4_ * (float)local_420._4_4_ +
                       auVar180._4_4_ * (float)local_430._4_4_ +
                       auVar93._4_4_ * (float)local_450._4_4_ +
                       auVar290._4_4_ * (float)local_440._4_4_;
                  auVar145._8_4_ =
                       auVar142._8_4_ * fStack_418 +
                       auVar180._8_4_ * fStack_428 +
                       auVar93._8_4_ * fStack_448 + auVar290._8_4_ * fStack_438;
                  auVar145._12_4_ =
                       auVar142._12_4_ * fStack_414 +
                       auVar180._12_4_ * fStack_424 +
                       auVar93._12_4_ * fStack_444 + auVar290._12_4_ * fStack_434;
                  auVar93 = vshufps_avx(auVar231,auVar231,0xc9);
                  auVar181._0_4_ = auVar145._0_4_ * auVar93._0_4_;
                  auVar181._4_4_ = auVar145._4_4_ * auVar93._4_4_;
                  auVar181._8_4_ = auVar145._8_4_ * auVar93._8_4_;
                  auVar181._12_4_ = auVar145._12_4_ * auVar93._12_4_;
                  auVar93 = vshufps_avx(auVar145,auVar145,0xc9);
                  auVar146._0_4_ = auVar231._0_4_ * auVar93._0_4_;
                  auVar146._4_4_ = auVar231._4_4_ * auVar93._4_4_;
                  auVar146._8_4_ = auVar231._8_4_ * auVar93._8_4_;
                  auVar146._12_4_ = auVar231._12_4_ * auVar93._12_4_;
                  auVar93 = vsubps_avx(auVar146,auVar181);
                  local_170 = vshufps_avx(auVar93,auVar93,0x55);
                  local_180[0] = (RTCHitN)local_170[0];
                  local_180[1] = (RTCHitN)local_170[1];
                  local_180[2] = (RTCHitN)local_170[2];
                  local_180[3] = (RTCHitN)local_170[3];
                  local_180[4] = (RTCHitN)local_170[4];
                  local_180[5] = (RTCHitN)local_170[5];
                  local_180[6] = (RTCHitN)local_170[6];
                  local_180[7] = (RTCHitN)local_170[7];
                  local_180[8] = (RTCHitN)local_170[8];
                  local_180[9] = (RTCHitN)local_170[9];
                  local_180[10] = (RTCHitN)local_170[10];
                  local_180[0xb] = (RTCHitN)local_170[0xb];
                  local_180[0xc] = (RTCHitN)local_170[0xc];
                  local_180[0xd] = (RTCHitN)local_170[0xd];
                  local_180[0xe] = (RTCHitN)local_170[0xe];
                  local_180[0xf] = (RTCHitN)local_170[0xf];
                  local_150 = vshufps_avx(auVar93,auVar93,0xaa);
                  local_160 = local_150;
                  local_130 = vshufps_avx(auVar93,auVar93,0);
                  local_140 = local_130;
                  local_120 = local_110;
                  local_100 = local_f0;
                  local_e0 = local_300._0_8_;
                  uStack_d8 = local_300._8_8_;
                  uStack_d0 = local_300._16_8_;
                  uStack_c8 = local_300._24_8_;
                  local_c0 = local_2e0._0_8_;
                  uStack_b8 = local_2e0._8_8_;
                  uStack_b0 = local_2e0._16_8_;
                  uStack_a8 = local_2e0._24_8_;
                  auVar105 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar119;
                  local_520 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar69 & 0xf) << 4));
                  local_510 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)((int)uVar69 >> 4) * 0x10);
                  local_480.valid = (int *)local_520;
                  local_480.geometryUserPtr = pGVar9->userPtr;
                  local_480.context = context->user;
                  local_480.ray = (RTCRayN *)ray;
                  local_480.hit = local_180;
                  local_480.N = 8;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_480);
                  }
                  auVar93 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                  auVar290 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                  auVar184._16_16_ = auVar290;
                  auVar184._0_16_ = auVar93;
                  auVar19 = auVar105 & ~auVar184;
                  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0x7f,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0xbf,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar19[0x1f] < '\0') {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_480);
                    }
                    auVar93 = vpcmpeqd_avx(local_520,ZEXT816(0) << 0x40);
                    auVar290 = vpcmpeqd_avx(local_510,ZEXT816(0) << 0x40);
                    auVar111._16_16_ = auVar290;
                    auVar111._0_16_ = auVar93;
                    auVar151._8_4_ = 0xff800000;
                    auVar151._0_8_ = 0xff800000ff800000;
                    auVar151._12_4_ = 0xff800000;
                    auVar151._16_4_ = 0xff800000;
                    auVar151._20_4_ = 0xff800000;
                    auVar151._24_4_ = 0xff800000;
                    auVar151._28_4_ = 0xff800000;
                    auVar19 = vblendvps_avx(auVar151,*(undefined1 (*) [32])(local_480.ray + 0x100),
                                            auVar111);
                    *(undefined1 (*) [32])(local_480.ray + 0x100) = auVar19;
                    auVar105 = auVar105 & ~auVar111;
                    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0x7f,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar105 >> 0xbf,0) != '\0') ||
                        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar105[0x1f] < '\0') {
                      bVar65 = 1;
                      goto LAB_00f5f18a;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar152;
                  goto LAB_00f5f188;
                }
LAB_00f5f18a:
                bVar73 = (bool)(bVar73 | bVar65);
              }
            }
          }
          break;
        }
        lVar68 = lVar68 + -1;
      } while (lVar68 != 0);
      goto LAB_00f5e192;
    }
    local_400 = vinsertps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar119),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }